

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  bool bVar56;
  bool bVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [12];
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint uVar92;
  ulong uVar93;
  ulong uVar94;
  byte bVar95;
  long lVar96;
  ulong uVar97;
  undefined4 uVar98;
  byte unaff_R14B;
  float fVar99;
  undefined8 uVar100;
  vint4 bi_2;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 extraout_var [60];
  undefined1 auVar129 [64];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar155;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  vint4 ai_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  vint4 ai;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar206;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar211;
  float fVar224;
  float fVar225;
  vint4 bi;
  undefined1 auVar235 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar219 [32];
  float fVar226;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined4 uVar230;
  float fVar231;
  undefined4 uVar232;
  float fVar233;
  float fVar240;
  float fVar241;
  undefined1 auVar234 [16];
  float fVar242;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar243;
  float fVar244;
  undefined1 auVar239 [64];
  float fVar245;
  float fVar255;
  float fVar256;
  vint4 ai_1;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar257;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar248 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  float s;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  float t_2;
  undefined1 auVar262 [16];
  float fVar266;
  float fVar267;
  undefined1 auVar261 [16];
  undefined1 auVar263 [16];
  float fVar268;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar283;
  undefined1 auVar274 [32];
  undefined1 auVar271 [64];
  float fVar272;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar273 [16];
  float fVar286;
  float fVar288;
  undefined1 auVar279 [32];
  float fVar281;
  float fVar282;
  float fVar284;
  float fVar285;
  float fVar287;
  undefined1 auVar280 [64];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar292 [64];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  float t;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_b11;
  int local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  ulong local_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  RTCFilterFunctionNArguments local_990;
  undefined1 local_960 [32];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 auStack_930 [16];
  undefined8 local_920;
  undefined4 local_918;
  float local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  uint local_904;
  uint local_900;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [4];
  undefined1 auStack_7dc [8];
  float fStack_7d4;
  undefined1 auStack_7d0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  Primitive *local_790;
  ulong local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  uint local_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  uint uStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  ulong local_640;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar3 = prim[1];
  uVar94 = (ulong)(byte)PVar3;
  fVar197 = *(float *)(prim + uVar94 * 0x19 + 0x12);
  auVar111 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar94 * 0x19 + 6));
  auVar212._0_4_ = fVar197 * (ray->dir).field_0.m128[0];
  auVar212._4_4_ = fVar197 * (ray->dir).field_0.m128[1];
  auVar212._8_4_ = fVar197 * (ray->dir).field_0.m128[2];
  auVar212._12_4_ = fVar197 * (ray->dir).field_0.m128[3];
  auVar101._0_4_ = fVar197 * auVar111._0_4_;
  auVar101._4_4_ = fVar197 * auVar111._4_4_;
  auVar101._8_4_ = fVar197 * auVar111._8_4_;
  auVar101._12_4_ = fVar197 * auVar111._12_4_;
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 4 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar270 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 5 + 6)));
  auVar270 = vcvtdq2ps_avx(auVar270);
  auVar262 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 6 + 6)));
  auVar262 = vcvtdq2ps_avx(auVar262);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar94 + 6)));
  auVar235 = vcvtdq2ps_avx(auVar235);
  uVar93 = (ulong)(uint)((int)(uVar94 * 9) * 2);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar94 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar280 = ZEXT1664(auVar103);
  uVar93 = (ulong)(uint)((int)(uVar94 * 5) << 2);
  auVar156 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar292 = ZEXT1664(auVar156);
  auVar298._4_4_ = auVar212._0_4_;
  auVar298._0_4_ = auVar212._0_4_;
  auVar298._8_4_ = auVar212._0_4_;
  auVar298._12_4_ = auVar212._0_4_;
  auVar131 = vshufps_avx(auVar212,auVar212,0x55);
  auVar102 = vshufps_avx(auVar212,auVar212,0xaa);
  fVar197 = auVar102._0_4_;
  auVar269._0_4_ = fVar197 * auVar262._0_4_;
  fVar233 = auVar102._4_4_;
  auVar269._4_4_ = fVar233 * auVar262._4_4_;
  fVar99 = auVar102._8_4_;
  auVar269._8_4_ = fVar99 * auVar262._8_4_;
  fVar240 = auVar102._12_4_;
  auVar269._12_4_ = fVar240 * auVar262._12_4_;
  auVar261._0_4_ = auVar235._0_4_ * fVar197;
  auVar261._4_4_ = auVar235._4_4_ * fVar233;
  auVar261._8_4_ = auVar235._8_4_ * fVar99;
  auVar261._12_4_ = auVar235._12_4_ * fVar240;
  auVar246._0_4_ = auVar156._0_4_ * fVar197;
  auVar246._4_4_ = auVar156._4_4_ * fVar233;
  auVar246._8_4_ = auVar156._8_4_ * fVar99;
  auVar246._12_4_ = auVar156._12_4_ * fVar240;
  auVar102 = vfmadd231ps_fma(auVar269,auVar131,auVar270);
  auVar132 = vfmadd231ps_fma(auVar261,auVar131,auVar136);
  auVar131 = vfmadd231ps_fma(auVar246,auVar103,auVar131);
  auVar175 = vfmadd231ps_fma(auVar102,auVar298,auVar111);
  auVar271 = ZEXT1664(auVar175);
  auVar132 = vfmadd231ps_fma(auVar132,auVar298,auVar7);
  auVar199 = vfmadd231ps_fma(auVar131,auVar104,auVar298);
  auVar299._4_4_ = auVar101._0_4_;
  auVar299._0_4_ = auVar101._0_4_;
  auVar299._8_4_ = auVar101._0_4_;
  auVar299._12_4_ = auVar101._0_4_;
  auVar131 = vshufps_avx(auVar101,auVar101,0x55);
  auVar102 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar197 = auVar102._0_4_;
  auVar213._0_4_ = fVar197 * auVar262._0_4_;
  fVar233 = auVar102._4_4_;
  auVar213._4_4_ = fVar233 * auVar262._4_4_;
  fVar99 = auVar102._8_4_;
  auVar213._8_4_ = fVar99 * auVar262._8_4_;
  fVar240 = auVar102._12_4_;
  auVar213._12_4_ = fVar240 * auVar262._12_4_;
  auVar130._0_4_ = auVar235._0_4_ * fVar197;
  auVar130._4_4_ = auVar235._4_4_ * fVar233;
  auVar130._8_4_ = auVar235._8_4_ * fVar99;
  auVar130._12_4_ = auVar235._12_4_ * fVar240;
  auVar102._0_4_ = auVar156._0_4_ * fVar197;
  auVar102._4_4_ = auVar156._4_4_ * fVar233;
  auVar102._8_4_ = auVar156._8_4_ * fVar99;
  auVar102._12_4_ = auVar156._12_4_ * fVar240;
  auVar270 = vfmadd231ps_fma(auVar213,auVar131,auVar270);
  auVar262 = vfmadd231ps_fma(auVar130,auVar131,auVar136);
  auVar136 = vfmadd231ps_fma(auVar102,auVar131,auVar103);
  auVar235 = vfmadd231ps_fma(auVar270,auVar299,auVar111);
  auVar103 = vfmadd231ps_fma(auVar262,auVar299,auVar7);
  auVar156 = vfmadd231ps_fma(auVar136,auVar299,auVar104);
  local_9e0._8_4_ = 0x7fffffff;
  local_9e0._0_8_ = 0x7fffffff7fffffff;
  local_9e0._12_4_ = 0x7fffffff;
  auVar111 = vandps_avx(auVar175,local_9e0);
  auVar198._8_4_ = 0x219392ef;
  auVar198._0_8_ = 0x219392ef219392ef;
  auVar198._12_4_ = 0x219392ef;
  auVar111 = vcmpps_avx(auVar111,auVar198,1);
  auVar270 = vblendvps_avx(auVar175,auVar198,auVar111);
  auVar111 = vandps_avx(auVar132,local_9e0);
  auVar111 = vcmpps_avx(auVar111,auVar198,1);
  auVar262 = vblendvps_avx(auVar132,auVar198,auVar111);
  auVar111 = vandps_avx(auVar199,local_9e0);
  auVar111 = vcmpps_avx(auVar111,auVar198,1);
  auVar111 = vblendvps_avx(auVar199,auVar198,auVar111);
  auVar7 = vrcpps_avx(auVar270);
  auVar234._8_4_ = 0x3f800000;
  auVar234._0_8_ = &DAT_3f8000003f800000;
  auVar234._12_4_ = 0x3f800000;
  auVar270 = vfnmadd213ps_fma(auVar270,auVar7,auVar234);
  auVar7 = vfmadd132ps_fma(auVar270,auVar7,auVar7);
  auVar270 = vrcpps_avx(auVar262);
  auVar262 = vfnmadd213ps_fma(auVar262,auVar270,auVar234);
  auVar136 = vfmadd132ps_fma(auVar262,auVar270,auVar270);
  auVar270 = vrcpps_avx(auVar111);
  auVar262 = vfnmadd213ps_fma(auVar111,auVar270,auVar234);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar94 * 7 + 6);
  auVar111 = vpmovsxwd_avx(auVar111);
  auVar104 = vfmadd132ps_fma(auVar262,auVar270,auVar270);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar235);
  auVar199._0_4_ = auVar7._0_4_ * auVar111._0_4_;
  auVar199._4_4_ = auVar7._4_4_ * auVar111._4_4_;
  auVar199._8_4_ = auVar7._8_4_ * auVar111._8_4_;
  auVar199._12_4_ = auVar7._12_4_ * auVar111._12_4_;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = *(ulong *)(prim + uVar94 * 9 + 6);
  auVar111 = vpmovsxwd_avx(auVar270);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar235);
  auVar214._0_4_ = auVar7._0_4_ * auVar111._0_4_;
  auVar214._4_4_ = auVar7._4_4_ * auVar111._4_4_;
  auVar214._8_4_ = auVar7._8_4_ * auVar111._8_4_;
  auVar214._12_4_ = auVar7._12_4_ * auVar111._12_4_;
  auVar132._1_3_ = 0;
  auVar132[0] = PVar3;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar270 = vpmovsxwd_avx(auVar262);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar94 * -2 + 6);
  auVar111 = vpmovsxwd_avx(auVar7);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar103);
  auVar247._0_4_ = auVar111._0_4_ * auVar136._0_4_;
  auVar247._4_4_ = auVar111._4_4_ * auVar136._4_4_;
  auVar247._8_4_ = auVar111._8_4_ * auVar136._8_4_;
  auVar247._12_4_ = auVar111._12_4_ * auVar136._12_4_;
  auVar111 = vcvtdq2ps_avx(auVar270);
  auVar111 = vsubps_avx(auVar111,auVar103);
  auVar131._0_4_ = auVar136._0_4_ * auVar111._0_4_;
  auVar131._4_4_ = auVar136._4_4_ * auVar111._4_4_;
  auVar131._8_4_ = auVar136._8_4_ * auVar111._8_4_;
  auVar131._12_4_ = auVar136._12_4_ * auVar111._12_4_;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + uVar93 + uVar94 + 6);
  auVar111 = vpmovsxwd_avx(auVar136);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar156);
  auVar175._0_4_ = auVar104._0_4_ * auVar111._0_4_;
  auVar175._4_4_ = auVar104._4_4_ * auVar111._4_4_;
  auVar175._8_4_ = auVar104._8_4_ * auVar111._8_4_;
  auVar175._12_4_ = auVar104._12_4_ * auVar111._12_4_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *(ulong *)(prim + uVar94 * 0x17 + 6);
  auVar111 = vpmovsxwd_avx(auVar235);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar156);
  auVar103._0_4_ = auVar104._0_4_ * auVar111._0_4_;
  auVar103._4_4_ = auVar104._4_4_ * auVar111._4_4_;
  auVar103._8_4_ = auVar104._8_4_ * auVar111._8_4_;
  auVar103._12_4_ = auVar104._12_4_ * auVar111._12_4_;
  auVar111 = vpminsd_avx(auVar199,auVar214);
  auVar270 = vpminsd_avx(auVar247,auVar131);
  auVar111 = vmaxps_avx(auVar111,auVar270);
  auVar270 = vpminsd_avx(auVar175,auVar103);
  uVar98 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar258._4_4_ = uVar98;
  auVar258._0_4_ = uVar98;
  auVar258._8_4_ = uVar98;
  auVar258._12_4_ = uVar98;
  auVar270 = vmaxps_avx(auVar270,auVar258);
  auVar111 = vmaxps_avx(auVar111,auVar270);
  local_4d0._0_4_ = auVar111._0_4_ * 0.99999964;
  local_4d0._4_4_ = auVar111._4_4_ * 0.99999964;
  local_4d0._8_4_ = auVar111._8_4_ * 0.99999964;
  local_4d0._12_4_ = auVar111._12_4_ * 0.99999964;
  auVar111 = vpmaxsd_avx(auVar199,auVar214);
  auVar270 = vpmaxsd_avx(auVar247,auVar131);
  auVar111 = vminps_avx(auVar111,auVar270);
  auVar270 = vpmaxsd_avx(auVar175,auVar103);
  fVar197 = ray->tfar;
  auVar156._4_4_ = fVar197;
  auVar156._0_4_ = fVar197;
  auVar156._8_4_ = fVar197;
  auVar156._12_4_ = fVar197;
  auVar270 = vminps_avx(auVar270,auVar156);
  auVar111 = vminps_avx(auVar111,auVar270);
  auVar104._0_4_ = auVar111._0_4_ * 1.0000004;
  auVar104._4_4_ = auVar111._4_4_ * 1.0000004;
  auVar104._8_4_ = auVar111._8_4_ * 1.0000004;
  auVar104._12_4_ = auVar111._12_4_ * 1.0000004;
  auVar132[4] = PVar3;
  auVar132._5_3_ = 0;
  auVar132[8] = PVar3;
  auVar132._9_3_ = 0;
  auVar132[0xc] = PVar3;
  auVar132._13_3_ = 0;
  auVar270 = vpcmpgtd_avx(auVar132,_DAT_01ff0cf0);
  auVar111 = vcmpps_avx(local_4d0,auVar104,2);
  auVar111 = vandps_avx(auVar111,auVar270);
  uVar92 = vmovmskps_avx(auVar111);
  local_b11 = uVar92 != 0;
  if (uVar92 == 0) {
    return local_b11;
  }
  uVar92 = uVar92 & 0xff;
  auVar125._16_16_ = mm_lookupmask_ps._240_16_;
  auVar125._0_16_ = mm_lookupmask_ps._240_16_;
  local_420 = vblendps_avx(auVar125,ZEXT832(0) << 0x20,0x80);
  local_760 = 0x7fffffff;
  uStack_75c = 0x7fffffff;
  uStack_758 = 0x7fffffff;
  uStack_754 = 0x7fffffff;
  uStack_750 = 0x7fffffff;
  uStack_74c = 0x7fffffff;
  uStack_748 = 0x7fffffff;
  uStack_744 = 0x7fffffff;
  local_6c0 = 0x80000000;
  uStack_6bc = 0x80000000;
  uStack_6b8 = 0x80000000;
  uStack_6b4 = 0x80000000;
  fStack_6b0 = -0.0;
  fStack_6ac = -0.0;
  fStack_6a8 = -0.0;
  uStack_6a4 = 0x80000000;
  local_790 = prim;
LAB_016b4b6f:
  lVar96 = 0;
  local_788 = (ulong)uVar92;
  for (uVar93 = local_788; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
    lVar96 = lVar96 + 1;
  }
  local_a88 = (ulong)*(uint *)(local_790 + 2);
  local_8e8 = (ulong)*(uint *)(local_790 + lVar96 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[local_a88].ptr;
  uVar93 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8e8);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar96 = *(long *)&pGVar4[1].time_range.upper;
  auVar111 = *(undefined1 (*) [16])(lVar96 + (long)p_Var5 * uVar93);
  auVar270 = *(undefined1 (*) [16])(lVar96 + (uVar93 + 1) * (long)p_Var5);
  local_788 = local_788 - 1 & local_788;
  if (local_788 != 0) {
    uVar97 = local_788 - 1 & local_788;
    for (uVar94 = local_788; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
    }
    if (uVar97 != 0) {
      for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar215._0_4_ = (auVar111._0_4_ + auVar270._0_4_) * 0.5;
  auVar215._4_4_ = (auVar111._4_4_ + auVar270._4_4_) * 0.5;
  auVar215._8_4_ = (auVar111._8_4_ + auVar270._8_4_) * 0.5;
  auVar215._12_4_ = (auVar111._12_4_ + auVar270._12_4_) * 0.5;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar262 = vsubps_avx(auVar215,(undefined1  [16])aVar1);
  auVar262 = vdpps_avx(auVar262,(undefined1  [16])aVar2,0x7f);
  auVar7 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar136 = vrcpss_avx(auVar7,auVar7);
  auVar254 = ZEXT1664(auVar136);
  auVar7 = vfnmadd213ss_fma(auVar136,auVar7,ZEXT416(0x40000000));
  fVar197 = auVar136._0_4_ * auVar7._0_4_;
  auVar239 = ZEXT464((uint)fVar197);
  fVar197 = auVar262._0_4_ * fVar197;
  local_7b0 = ZEXT416((uint)fVar197);
  auVar216._4_4_ = fVar197;
  auVar216._0_4_ = fVar197;
  auVar216._8_4_ = fVar197;
  auVar216._12_4_ = fVar197;
  fStack_a10 = fVar197;
  _local_a20 = auVar216;
  fStack_a0c = fVar197;
  fStack_a08 = fVar197;
  fStack_a04 = fVar197;
  auVar262 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar216);
  auVar262 = vblendps_avx(auVar262,_DAT_01feba10,8);
  local_9a0 = vsubps_avx(auVar111,auVar262);
  local_9b0 = vsubps_avx(*(undefined1 (*) [16])(lVar96 + (uVar93 + 2) * (long)p_Var5),auVar262);
  local_9c0 = vsubps_avx(auVar270,auVar262);
  _local_9d0 = vsubps_avx(*(undefined1 (*) [16])(lVar96 + (uVar93 + 3) * (long)p_Var5),auVar262);
  auVar111 = vmovshdup_avx(local_9a0);
  local_2a0 = auVar111._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar111 = vshufps_avx(local_9a0,local_9a0,0xaa);
  local_1a0 = auVar111._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar111 = vshufps_avx(local_9a0,local_9a0,0xff);
  local_1c0 = auVar111._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar111 = vmovshdup_avx(local_9c0);
  local_1e0 = auVar111._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar111 = vshufps_avx(local_9c0,local_9c0,0xaa);
  local_2c0 = auVar111._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar111 = vshufps_avx(local_9c0,local_9c0,0xff);
  local_2e0 = auVar111._0_8_;
  uStack_2d8 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2c8 = local_2e0;
  auVar111 = vmovshdup_avx(local_9b0);
  local_300 = auVar111._0_8_;
  uStack_2f8 = local_300;
  uStack_2f0 = local_300;
  uStack_2e8 = local_300;
  auVar111 = vshufps_avx(local_9b0,local_9b0,0xaa);
  local_320 = auVar111._0_8_;
  uStack_318 = local_320;
  uStack_310 = local_320;
  uStack_308 = local_320;
  auVar111 = vshufps_avx(local_9b0,local_9b0,0xff);
  local_340 = auVar111._0_8_;
  uStack_338 = local_340;
  uStack_330 = local_340;
  uStack_328 = local_340;
  auVar111 = vmovshdup_avx(_local_9d0);
  local_360 = auVar111._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar111 = vshufps_avx(_local_9d0,_local_9d0,0xaa);
  local_380 = auVar111._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar111 = vshufps_avx(_local_9d0,_local_9d0,0xff);
  local_3a0 = auVar111._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar105._0_4_ = aVar2.x * aVar2.x;
  auVar105._4_4_ = aVar2.y * aVar2.y;
  auVar105._8_4_ = aVar2.z * aVar2.z;
  auVar105._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar111 = vshufps_avx(auVar105,auVar105,0xaa);
  uVar98 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_540._4_4_ = uVar98;
  local_540._0_4_ = uVar98;
  fStack_538 = (float)uVar98;
  fStack_534 = (float)uVar98;
  fStack_530 = (float)uVar98;
  fStack_52c = (float)uVar98;
  fStack_528 = (float)uVar98;
  register0x0000131c = uVar98;
  uVar100 = auVar111._0_8_;
  auVar219._8_8_ = uVar100;
  auVar219._0_8_ = uVar100;
  auVar219._16_8_ = uVar100;
  auVar219._24_8_ = uVar100;
  auVar111 = vfmadd231ps_fma(auVar219,_local_540,_local_540);
  uVar98 = *(undefined4 *)&(ray->dir).field_0;
  local_600._4_4_ = uVar98;
  local_600._0_4_ = uVar98;
  fStack_5f8 = (float)uVar98;
  fStack_5f4 = (float)uVar98;
  fStack_5f0 = (float)uVar98;
  fStack_5ec = (float)uVar98;
  fStack_5e8 = (float)uVar98;
  register0x0000121c = uVar98;
  auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),_local_600,_local_600);
  local_640 = 1;
  uVar93 = 0;
  bVar95 = 0;
  local_620 = (ray->dir).field_0.m128[2];
  local_3c0 = local_9a0._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  local_3e0 = local_9c0._0_4_;
  uStack_3dc = local_3e0;
  uStack_3d8 = local_3e0;
  uStack_3d4 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3cc = local_3e0;
  uStack_3c8 = local_3e0;
  uStack_3c4 = local_3e0;
  local_400 = local_9b0._0_4_;
  uStack_3fc = local_400;
  uStack_3f8 = local_400;
  uStack_3f4 = local_400;
  uStack_3f0 = local_400;
  uStack_3ec = local_400;
  uStack_3e8 = local_400;
  uStack_3e4 = local_400;
  local_220 = local_9d0._0_4_;
  auVar222._4_4_ = uStack_75c;
  auVar222._0_4_ = local_760;
  auVar222._8_4_ = uStack_758;
  auVar222._12_4_ = uStack_754;
  auVar222._16_4_ = uStack_750;
  auVar222._20_4_ = uStack_74c;
  auVar222._24_4_ = uStack_748;
  auVar222._28_4_ = uStack_744;
  local_440 = vandps_avx(ZEXT1632(auVar111),auVar222);
  local_7a0 = ZEXT816(0x3f80000000000000);
  local_200 = ZEXT1632(auVar111);
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  do {
    auVar165._8_4_ = 0x3f800000;
    auVar165._0_8_ = &DAT_3f8000003f800000;
    auVar165._12_4_ = 0x3f800000;
    auVar165._16_4_ = 0x3f800000;
    auVar165._20_4_ = 0x3f800000;
    auVar165._24_4_ = 0x3f800000;
    auVar165._28_4_ = 0x3f800000;
    auVar111 = vmovshdup_avx(local_7a0);
    fVar99 = local_7a0._0_4_;
    fVar233 = auVar111._0_4_ - fVar99;
    fVar197 = fVar233 * 0.04761905;
    local_6e0._4_4_ = fVar99;
    local_6e0._0_4_ = fVar99;
    local_6e0._8_4_ = fVar99;
    local_6e0._12_4_ = fVar99;
    local_6e0._16_4_ = fVar99;
    local_6e0._20_4_ = fVar99;
    local_6e0._24_4_ = fVar99;
    local_6e0._28_4_ = fVar99;
    local_960._4_4_ = fVar233;
    local_960._0_4_ = fVar233;
    local_960._8_4_ = fVar233;
    local_960._12_4_ = fVar233;
    local_960._16_4_ = fVar233;
    local_960._20_4_ = fVar233;
    local_960._24_4_ = fVar233;
    local_960._28_4_ = fVar233;
    auVar111 = vfmadd231ps_fma(local_6e0,local_960,_DAT_02020f20);
    auVar125 = vsubps_avx(auVar165,ZEXT1632(auVar111));
    fVar206 = auVar111._0_4_;
    fVar286 = auVar111._4_4_;
    fVar288 = auVar111._8_4_;
    fVar231 = auVar111._12_4_;
    fVar233 = auVar125._0_4_;
    fVar99 = auVar125._4_4_;
    fVar240 = auVar125._8_4_;
    fVar241 = auVar125._12_4_;
    fVar242 = auVar125._16_4_;
    fVar243 = auVar125._20_4_;
    fVar244 = auVar125._24_4_;
    fVar245 = fVar206 * 3.0;
    fVar255 = fVar286 * 3.0;
    fVar256 = fVar288 * 3.0;
    fVar257 = fVar231 * 3.0;
    auVar174._0_4_ = fVar233 * fVar233;
    auVar174._4_4_ = fVar99 * fVar99;
    auVar174._8_4_ = fVar240 * fVar240;
    auVar174._12_4_ = fVar241 * fVar241;
    auVar174._16_4_ = fVar242 * fVar242;
    auVar174._20_4_ = fVar243 * fVar243;
    auVar174._28_36_ = auVar271._28_36_;
    auVar174._24_4_ = fVar244 * fVar244;
    fVar209 = auVar125._28_4_;
    auVar271._0_4_ = (auVar174._0_4_ * (fVar233 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar271._4_4_ = (auVar174._4_4_ * (fVar99 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar271._8_4_ = (auVar174._8_4_ * (fVar240 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar271._12_4_ = (auVar174._12_4_ * (fVar241 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar271._16_4_ = (auVar174._16_4_ * (fVar242 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar271._20_4_ = (auVar174._20_4_ * (fVar243 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar271._28_36_ = auVar292._28_36_;
    auVar271._24_4_ = (auVar174._24_4_ * (fVar244 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar125 = auVar271._0_32_;
    fVar211 = fVar206 * fVar206 * (float)((uint)fVar233 ^ local_6c0) * 0.5;
    fVar224 = fVar286 * fVar286 * (float)((uint)fVar99 ^ uStack_6bc) * 0.5;
    fVar225 = fVar288 * fVar288 * (float)((uint)fVar240 ^ uStack_6b8) * 0.5;
    fVar226 = fVar231 * fVar231 * (float)((uint)fVar241 ^ uStack_6b4) * 0.5;
    fVar227 = (float)((uint)fVar242 ^ (uint)fStack_6b0) * 0.0 * 0.0 * 0.5;
    fVar228 = (float)((uint)fVar243 ^ (uint)fStack_6ac) * 0.0 * 0.0 * 0.5;
    fVar229 = (float)((uint)fVar244 ^ (uint)fStack_6a8) * 0.0 * 0.0 * 0.5;
    auVar8._4_4_ = fStack_21c * fVar224;
    auVar8._0_4_ = local_220 * fVar211;
    auVar8._8_4_ = fStack_218 * fVar225;
    auVar8._12_4_ = fStack_214 * fVar226;
    auVar8._16_4_ = fStack_210 * fVar227;
    auVar8._20_4_ = fStack_20c * fVar228;
    auVar8._24_4_ = fStack_208 * fVar229;
    auVar8._28_4_ = (uint)fVar209 ^ uStack_6a4;
    auVar9._4_4_ = fVar224 * local_360._4_4_;
    auVar9._0_4_ = fVar211 * (float)local_360;
    auVar9._8_4_ = fVar225 * (float)uStack_358;
    auVar9._12_4_ = fVar226 * uStack_358._4_4_;
    auVar9._16_4_ = fVar227 * (float)uStack_350;
    auVar9._20_4_ = fVar228 * uStack_350._4_4_;
    auVar9._24_4_ = fVar229 * (float)uStack_348;
    auVar9._28_4_ = auVar239._28_4_ + -5.0 + 2.0;
    auVar58._4_4_ = fVar224 * local_380._4_4_;
    auVar58._0_4_ = fVar211 * (float)local_380;
    auVar58._8_4_ = fVar225 * (float)uStack_378;
    auVar58._12_4_ = fVar226 * uStack_378._4_4_;
    auVar58._16_4_ = fVar227 * (float)uStack_370;
    auVar58._20_4_ = fVar228 * uStack_370._4_4_;
    auVar58._24_4_ = fVar229 * (float)uStack_368;
    auVar58._28_4_ = 0x3f800000;
    auVar10._4_4_ = fVar224 * local_3a0._4_4_;
    auVar10._0_4_ = fVar211 * (float)local_3a0;
    auVar10._8_4_ = fVar225 * (float)uStack_398;
    auVar10._12_4_ = fVar226 * uStack_398._4_4_;
    auVar10._16_4_ = fVar227 * (float)uStack_390;
    auVar10._20_4_ = fVar228 * uStack_390._4_4_;
    auVar10._24_4_ = fVar229 * (float)uStack_388;
    auVar10._28_4_ = 0xc0a00000;
    auVar71._4_4_ = uStack_3fc;
    auVar71._0_4_ = local_400;
    auVar71._8_4_ = uStack_3f8;
    auVar71._12_4_ = uStack_3f4;
    auVar71._16_4_ = uStack_3f0;
    auVar71._20_4_ = uStack_3ec;
    auVar71._24_4_ = uStack_3e8;
    auVar71._28_4_ = uStack_3e4;
    auVar111 = vfmadd231ps_fma(auVar8,auVar125,auVar71);
    auVar81._8_8_ = uStack_2f8;
    auVar81._0_8_ = local_300;
    auVar81._16_8_ = uStack_2f0;
    auVar81._24_8_ = uStack_2e8;
    auVar270 = vfmadd231ps_fma(auVar9,auVar125,auVar81);
    auVar79._8_8_ = uStack_318;
    auVar79._0_8_ = local_320;
    auVar79._16_8_ = uStack_310;
    auVar79._24_8_ = uStack_308;
    auVar262 = vfmadd231ps_fma(auVar58,auVar125,auVar79);
    auVar77._8_8_ = uStack_338;
    auVar77._0_8_ = local_340;
    auVar77._16_8_ = uStack_330;
    auVar77._24_8_ = uStack_328;
    auVar7 = vfmadd231ps_fma(auVar10,auVar125,auVar77);
    auVar123._4_4_ = fVar99 * fVar99 * (float)((uint)fVar286 ^ uStack_6bc) * 0.5;
    auVar123._0_4_ = fVar233 * fVar233 * (float)((uint)fVar206 ^ local_6c0) * 0.5;
    auVar123._8_4_ = fVar240 * fVar240 * (float)((uint)fVar288 ^ uStack_6b8) * 0.5;
    auVar123._12_4_ = fVar241 * fVar241 * (float)((uint)fVar231 ^ uStack_6b4) * 0.5;
    auVar123._16_4_ = fVar242 * fVar242 * fStack_6b0 * 0.5;
    auVar123._20_4_ = fVar243 * fVar243 * fStack_6ac * 0.5;
    auVar123._24_4_ = fVar244 * fVar244 * fStack_6a8 * 0.5;
    auVar123._28_4_ = auVar280._28_4_;
    auVar11._4_4_ = ((fVar255 + -5.0) * fVar286 * fVar286 + 2.0) * 0.5;
    auVar11._0_4_ = ((fVar245 + -5.0) * fVar206 * fVar206 + 2.0) * 0.5;
    auVar11._8_4_ = ((fVar256 + -5.0) * fVar288 * fVar288 + 2.0) * 0.5;
    auVar11._12_4_ = ((fVar257 + -5.0) * fVar231 * fVar231 + 2.0) * 0.5;
    auVar11._16_4_ = 0x3f800000;
    auVar11._20_4_ = 0x3f800000;
    auVar11._24_4_ = 0x3f800000;
    auVar11._28_4_ = auVar292._28_4_ + 2.0;
    auVar73._4_4_ = uStack_3dc;
    auVar73._0_4_ = local_3e0;
    auVar73._8_4_ = uStack_3d8;
    auVar73._12_4_ = uStack_3d4;
    auVar73._16_4_ = uStack_3d0;
    auVar73._20_4_ = uStack_3cc;
    auVar73._24_4_ = uStack_3c8;
    auVar73._28_4_ = uStack_3c4;
    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar11,auVar73);
    auVar89._8_8_ = uStack_1d8;
    auVar89._0_8_ = local_1e0;
    auVar89._16_8_ = uStack_1d0;
    auVar89._24_8_ = uStack_1c8;
    auVar270 = vfmadd231ps_fma(ZEXT1632(auVar270),auVar11,auVar89);
    auVar85._8_8_ = uStack_2b8;
    auVar85._0_8_ = local_2c0;
    auVar85._16_8_ = uStack_2b0;
    auVar85._24_8_ = uStack_2a8;
    auVar262 = vfmadd231ps_fma(ZEXT1632(auVar262),auVar11,auVar85);
    auVar83._8_8_ = uStack_2d8;
    auVar83._0_8_ = local_2e0;
    auVar83._16_8_ = uStack_2d0;
    auVar83._24_8_ = uStack_2c8;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar11,auVar83);
    auVar75._4_4_ = uStack_3bc;
    auVar75._0_4_ = local_3c0;
    auVar75._8_4_ = uStack_3b8;
    auVar75._12_4_ = uStack_3b4;
    auVar75._16_4_ = uStack_3b0;
    auVar75._20_4_ = uStack_3ac;
    auVar75._24_4_ = uStack_3a8;
    auVar75._28_4_ = uStack_3a4;
    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar123,auVar75);
    auVar87._8_8_ = uStack_298;
    auVar87._0_8_ = local_2a0;
    auVar87._16_8_ = uStack_290;
    auVar87._24_8_ = uStack_288;
    auVar270 = vfmadd231ps_fma(ZEXT1632(auVar270),auVar123,auVar87);
    local_ae0 = ZEXT1632(auVar270);
    auVar91._8_8_ = uStack_198;
    auVar91._0_8_ = local_1a0;
    auVar91._16_8_ = uStack_190;
    auVar91._24_8_ = uStack_188;
    auVar270 = vfmadd231ps_fma(ZEXT1632(auVar262),auVar123,auVar91);
    auVar90._8_8_ = uStack_1b8;
    auVar90._0_8_ = local_1c0;
    auVar90._16_8_ = uStack_1b0;
    auVar90._24_8_ = uStack_1a8;
    auVar262 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar90,auVar123);
    auVar12._4_4_ = (fVar99 + fVar99) * fVar286;
    auVar12._0_4_ = (fVar233 + fVar233) * fVar206;
    auVar12._8_4_ = (fVar240 + fVar240) * fVar288;
    auVar12._12_4_ = (fVar241 + fVar241) * fVar231;
    auVar12._16_4_ = (fVar242 + fVar242) * 0.0;
    auVar12._20_4_ = (fVar243 + fVar243) * 0.0;
    auVar12._24_4_ = (fVar244 + fVar244) * 0.0;
    auVar12._28_4_ = 0;
    auVar125 = vsubps_avx(auVar12,auVar174._0_32_);
    fVar211 = auVar254._28_4_ + 2.0;
    auVar144._4_4_ = (fVar99 + fVar99) * (fVar255 + 2.0);
    auVar144._0_4_ = (fVar233 + fVar233) * (fVar245 + 2.0);
    auVar144._8_4_ = (fVar240 + fVar240) * (fVar256 + 2.0);
    auVar144._12_4_ = (fVar241 + fVar241) * (fVar257 + 2.0);
    auVar144._16_4_ = (fVar242 + fVar242) * 2.0;
    auVar144._20_4_ = (fVar243 + fVar243) * 2.0;
    auVar144._24_4_ = (fVar244 + fVar244) * 2.0;
    auVar144._28_4_ = fVar211;
    auVar237._4_4_ = fVar99 * fVar99 * 3.0;
    auVar237._0_4_ = fVar233 * fVar233 * 3.0;
    auVar237._8_4_ = fVar240 * fVar240 * 3.0;
    auVar237._12_4_ = fVar241 * fVar241 * 3.0;
    auVar237._16_4_ = fVar242 * fVar242 * 3.0;
    auVar237._20_4_ = fVar243 * fVar243 * 3.0;
    auVar237._24_4_ = fVar244 * fVar244 * 3.0;
    auVar237._28_4_ = fVar209;
    auVar222 = vsubps_avx(auVar144,auVar237);
    auVar219 = vsubps_avx(ZEXT1632(CONCAT412(fVar231 * fVar231,
                                             CONCAT48(fVar288 * fVar288,
                                                      CONCAT44(fVar286 * fVar286,fVar206 * fVar206))
                                            )),auVar12);
    auVar15._4_4_ = auVar125._4_4_ * 0.5;
    auVar15._0_4_ = auVar125._0_4_ * 0.5;
    auVar15._8_4_ = auVar125._8_4_ * 0.5;
    auVar15._12_4_ = auVar125._12_4_ * 0.5;
    auVar15._16_4_ = auVar125._16_4_ * 0.5;
    auVar15._20_4_ = auVar125._20_4_ * 0.5;
    auVar15._24_4_ = auVar125._24_4_ * 0.5;
    auVar15._28_4_ = fVar211;
    auVar16._28_4_ = auVar254._28_4_ + -5.0 + 0.0;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(((fVar231 + fVar231) * (fVar257 + -5.0) + fVar257 * fVar231) * 0.5,
                            CONCAT48(((fVar288 + fVar288) * (fVar256 + -5.0) + fVar256 * fVar288) *
                                     0.5,CONCAT44(((fVar286 + fVar286) * (fVar255 + -5.0) +
                                                  fVar255 * fVar286) * 0.5,
                                                  ((fVar206 + fVar206) * (fVar245 + -5.0) +
                                                  fVar245 * fVar206) * 0.5))));
    auVar166._4_4_ = auVar222._4_4_ * 0.5;
    auVar166._0_4_ = auVar222._0_4_ * 0.5;
    auVar166._8_4_ = auVar222._8_4_ * 0.5;
    auVar166._12_4_ = auVar222._12_4_ * 0.5;
    auVar166._16_4_ = auVar222._16_4_ * 0.5;
    auVar166._20_4_ = auVar222._20_4_ * 0.5;
    fVar99 = auVar222._28_4_;
    auVar166._24_4_ = auVar222._24_4_ * 0.5;
    auVar166._28_4_ = fVar99;
    fVar233 = auVar219._0_4_ * 0.5;
    fVar240 = auVar219._4_4_ * 0.5;
    fVar241 = auVar219._8_4_ * 0.5;
    fVar242 = auVar219._12_4_ * 0.5;
    fVar243 = auVar219._16_4_ * 0.5;
    fVar244 = auVar219._20_4_ * 0.5;
    fVar211 = auVar219._24_4_ * 0.5;
    auVar264._4_4_ = fStack_21c * fVar240;
    auVar264._0_4_ = local_220 * fVar233;
    auVar264._8_4_ = fStack_218 * fVar241;
    auVar264._12_4_ = fStack_214 * fVar242;
    auVar264._16_4_ = fStack_210 * fVar243;
    auVar264._20_4_ = fStack_20c * fVar244;
    auVar264._24_4_ = fStack_208 * fVar211;
    auVar264._28_4_ = fStack_204;
    auVar274._4_4_ = fVar240 * local_360._4_4_;
    auVar274._0_4_ = fVar233 * (float)local_360;
    auVar274._8_4_ = fVar241 * (float)uStack_358;
    auVar274._12_4_ = fVar242 * uStack_358._4_4_;
    auVar274._16_4_ = fVar243 * (float)uStack_350;
    auVar274._20_4_ = fVar244 * uStack_350._4_4_;
    auVar274._24_4_ = fVar211 * (float)uStack_348;
    auVar274._28_4_ = 0x40000000;
    auVar300._4_4_ = fVar240 * local_380._4_4_;
    auVar300._0_4_ = fVar233 * (float)local_380;
    auVar300._8_4_ = fVar241 * (float)uStack_378;
    auVar300._12_4_ = fVar242 * uStack_378._4_4_;
    auVar300._16_4_ = fVar243 * (float)uStack_370;
    auVar300._20_4_ = fVar244 * uStack_370._4_4_;
    auVar300._24_4_ = fVar211 * (float)uStack_368;
    auVar300._28_4_ = auVar125._28_4_;
    auVar6._4_4_ = fVar240 * local_3a0._4_4_;
    auVar6._0_4_ = fVar233 * (float)local_3a0;
    auVar6._8_4_ = fVar241 * (float)uStack_398;
    auVar6._12_4_ = fVar242 * uStack_398._4_4_;
    auVar6._16_4_ = fVar243 * (float)uStack_390;
    auVar6._20_4_ = fVar244 * uStack_390._4_4_;
    auVar6._24_4_ = fVar211 * (float)uStack_388;
    auVar6._28_4_ = auVar219._28_4_;
    auVar72._4_4_ = uStack_3fc;
    auVar72._0_4_ = local_400;
    auVar72._8_4_ = uStack_3f8;
    auVar72._12_4_ = uStack_3f4;
    auVar72._16_4_ = uStack_3f0;
    auVar72._20_4_ = uStack_3ec;
    auVar72._24_4_ = uStack_3e8;
    auVar72._28_4_ = uStack_3e4;
    auVar7 = vfmadd231ps_fma(auVar264,auVar166,auVar72);
    auVar82._8_8_ = uStack_2f8;
    auVar82._0_8_ = local_300;
    auVar82._16_8_ = uStack_2f0;
    auVar82._24_8_ = uStack_2e8;
    auVar136 = vfmadd231ps_fma(auVar274,auVar166,auVar82);
    auVar80._8_8_ = uStack_318;
    auVar80._0_8_ = local_320;
    auVar80._16_8_ = uStack_310;
    auVar80._24_8_ = uStack_308;
    auVar235 = vfmadd231ps_fma(auVar300,auVar166,auVar80);
    auVar78._8_8_ = uStack_338;
    auVar78._0_8_ = local_340;
    auVar78._16_8_ = uStack_330;
    auVar78._24_8_ = uStack_328;
    auVar104 = vfmadd231ps_fma(auVar6,auVar166,auVar78);
    auVar74._4_4_ = uStack_3dc;
    auVar74._0_4_ = local_3e0;
    auVar74._8_4_ = uStack_3d8;
    auVar74._12_4_ = uStack_3d4;
    auVar74._16_4_ = uStack_3d0;
    auVar74._20_4_ = uStack_3cc;
    auVar74._24_4_ = uStack_3c8;
    auVar74._28_4_ = uStack_3c4;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar16,auVar74);
    auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar16,auVar89);
    auVar86._8_8_ = uStack_2b8;
    auVar86._0_8_ = local_2c0;
    auVar86._16_8_ = uStack_2b0;
    auVar86._24_8_ = uStack_2a8;
    auVar235 = vfmadd231ps_fma(ZEXT1632(auVar235),auVar16,auVar86);
    auVar84._8_8_ = uStack_2d8;
    auVar84._0_8_ = local_2e0;
    auVar84._16_8_ = uStack_2d0;
    auVar84._24_8_ = uStack_2c8;
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar16,auVar84);
    auVar76._4_4_ = uStack_3bc;
    auVar76._0_4_ = local_3c0;
    auVar76._8_4_ = uStack_3b8;
    auVar76._12_4_ = uStack_3b4;
    auVar76._16_4_ = uStack_3b0;
    auVar76._20_4_ = uStack_3ac;
    auVar76._24_4_ = uStack_3a8;
    auVar76._28_4_ = uStack_3a4;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar15,auVar76);
    auVar88._8_8_ = uStack_298;
    auVar88._0_8_ = local_2a0;
    auVar88._16_8_ = uStack_290;
    auVar88._24_8_ = uStack_288;
    auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar15,auVar88);
    auVar235 = vfmadd231ps_fma(ZEXT1632(auVar235),auVar15,auVar91);
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar90,auVar15);
    fVar233 = auVar7._0_4_ * fVar197;
    fVar241 = auVar7._4_4_ * fVar197;
    auVar18._4_4_ = fVar241;
    auVar18._0_4_ = fVar233;
    fVar211 = auVar7._8_4_ * fVar197;
    auVar18._8_4_ = fVar211;
    fVar224 = auVar7._12_4_ * fVar197;
    auVar18._12_4_ = fVar224;
    auVar18._16_4_ = fVar197 * 0.0;
    auVar18._20_4_ = fVar197 * 0.0;
    auVar18._24_4_ = fVar197 * 0.0;
    auVar18._28_4_ = 0x3f000000;
    local_820._0_4_ = auVar136._0_4_ * fVar197;
    local_820._4_4_ = auVar136._4_4_ * fVar197;
    local_820._8_4_ = auVar136._8_4_ * fVar197;
    local_820._12_4_ = auVar136._12_4_ * fVar197;
    local_820._16_4_ = fVar197 * 0.0;
    local_820._20_4_ = fVar197 * 0.0;
    local_820._24_4_ = fVar197 * 0.0;
    local_820._28_4_ = 0;
    fVar272 = auVar235._0_4_ * fVar197;
    fVar281 = auVar235._4_4_ * fVar197;
    local_840._4_4_ = fVar281;
    local_840._0_4_ = fVar272;
    fVar282 = auVar235._8_4_ * fVar197;
    local_840._8_4_ = fVar282;
    fVar283 = auVar235._12_4_ * fVar197;
    local_840._12_4_ = fVar283;
    fVar284 = fVar197 * 0.0;
    local_840._16_4_ = fVar284;
    fVar285 = fVar197 * 0.0;
    local_840._20_4_ = fVar285;
    fVar287 = fVar197 * 0.0;
    local_840._24_4_ = fVar287;
    local_840._28_4_ = fVar209 + fVar209;
    fVar240 = fVar197 * auVar104._0_4_;
    fVar242 = fVar197 * auVar104._4_4_;
    auVar13._4_4_ = fVar242;
    auVar13._0_4_ = fVar240;
    fVar243 = fVar197 * auVar104._8_4_;
    auVar13._8_4_ = fVar243;
    fVar244 = fVar197 * auVar104._12_4_;
    auVar13._12_4_ = fVar244;
    auVar13._16_4_ = fVar197 * 0.0;
    auVar13._20_4_ = fVar197 * 0.0;
    auVar13._24_4_ = fVar197 * 0.0;
    auVar13._28_4_ = fVar99;
    local_b00 = ZEXT1632(auVar111);
    auVar15 = vpermps_avx2(_DAT_0205d4a0,local_b00);
    auVar16 = vpermps_avx2(_DAT_0205d4a0,local_ae0);
    _local_7e0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar270));
    auVar9 = vsubps_avx(auVar15,ZEXT1632(auVar111));
    auVar10 = vsubps_avx(_local_7e0,ZEXT1632(auVar270));
    auVar166 = ZEXT1632(auVar270);
    fVar225 = auVar10._0_4_;
    fVar226 = auVar10._4_4_;
    auVar14._4_4_ = fVar226 * fVar241;
    auVar14._0_4_ = fVar225 * fVar233;
    fVar229 = auVar10._8_4_;
    auVar14._8_4_ = fVar229 * fVar211;
    fVar206 = auVar10._12_4_;
    auVar14._12_4_ = fVar206 * fVar224;
    fVar245 = auVar10._16_4_;
    auVar14._16_4_ = fVar245 * fVar197 * 0.0;
    fVar256 = auVar10._20_4_;
    auVar14._20_4_ = fVar256 * fVar197 * 0.0;
    fVar257 = auVar10._24_4_;
    auVar14._24_4_ = fVar257 * fVar197 * 0.0;
    auVar14._28_4_ = auVar15._28_4_;
    auVar111 = vfmsub231ps_fma(auVar14,local_840,auVar9);
    auVar123 = vsubps_avx(auVar16,local_ae0);
    fVar267 = auVar9._0_4_;
    fVar268 = auVar9._4_4_;
    auVar19._4_4_ = fVar268 * local_820._4_4_;
    auVar19._0_4_ = fVar267 * local_820._0_4_;
    fVar293 = auVar9._8_4_;
    auVar19._8_4_ = fVar293 * local_820._8_4_;
    fVar294 = auVar9._12_4_;
    auVar19._12_4_ = fVar294 * local_820._12_4_;
    fVar295 = auVar9._16_4_;
    auVar19._16_4_ = fVar295 * local_820._16_4_;
    fVar296 = auVar9._20_4_;
    auVar19._20_4_ = fVar296 * local_820._20_4_;
    fVar297 = auVar9._24_4_;
    auVar19._24_4_ = fVar297 * local_820._24_4_;
    auVar19._28_4_ = auVar16._28_4_;
    auVar270 = vfmsub231ps_fma(auVar19,auVar18,auVar123);
    auVar111 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar270._12_4_ * auVar270._12_4_,
                                                  CONCAT48(auVar270._8_4_ * auVar270._8_4_,
                                                           CONCAT44(auVar270._4_4_ * auVar270._4_4_,
                                                                    auVar270._0_4_ * auVar270._0_4_)
                                                          ))),ZEXT1632(auVar111),ZEXT1632(auVar111))
    ;
    fVar228 = auVar123._0_4_;
    fVar288 = auVar123._4_4_;
    auVar20._4_4_ = fVar288 * fVar281;
    auVar20._0_4_ = fVar228 * fVar272;
    fVar207 = auVar123._8_4_;
    auVar20._8_4_ = fVar207 * fVar282;
    fVar208 = auVar123._12_4_;
    auVar20._12_4_ = fVar208 * fVar283;
    fVar155 = auVar123._16_4_;
    auVar20._16_4_ = fVar155 * fVar284;
    fVar210 = auVar123._20_4_;
    auVar20._20_4_ = fVar210 * fVar285;
    fVar266 = auVar123._24_4_;
    auVar20._24_4_ = fVar266 * fVar287;
    auVar20._28_4_ = local_7e0._28_4_;
    auVar7 = vfmsub231ps_fma(auVar20,local_820,auVar10);
    auVar192._0_4_ = fVar225 * fVar225;
    auVar192._4_4_ = fVar226 * fVar226;
    auVar192._8_4_ = fVar229 * fVar229;
    auVar192._12_4_ = fVar206 * fVar206;
    auVar192._16_4_ = fVar245 * fVar245;
    auVar192._20_4_ = fVar256 * fVar256;
    auVar192._24_4_ = fVar257 * fVar257;
    auVar192._28_4_ = 0;
    auVar270 = vfmadd231ps_fma(auVar192,auVar123,auVar123);
    auVar270 = vfmadd231ps_fma(ZEXT1632(auVar270),auVar9,auVar9);
    auVar125 = vrcpps_avx(ZEXT1632(auVar270));
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar111),ZEXT1632(auVar7),ZEXT1632(auVar7));
    auVar167._8_4_ = 0x3f800000;
    auVar167._0_8_ = &DAT_3f8000003f800000;
    auVar167._12_4_ = 0x3f800000;
    auVar167._16_4_ = 0x3f800000;
    auVar167._20_4_ = 0x3f800000;
    auVar167._24_4_ = 0x3f800000;
    auVar167._28_4_ = 0x3f800000;
    auVar111 = vfnmadd213ps_fma(auVar125,ZEXT1632(auVar270),auVar167);
    auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar125,auVar125);
    local_a40 = vpermps_avx2(_DAT_0205d4a0,auVar18);
    local_a60 = vpermps_avx2(_DAT_0205d4a0,local_840);
    auVar21._4_4_ = fVar226 * local_a40._4_4_;
    auVar21._0_4_ = fVar225 * local_a40._0_4_;
    auVar21._8_4_ = fVar229 * local_a40._8_4_;
    auVar21._12_4_ = fVar206 * local_a40._12_4_;
    auVar21._16_4_ = fVar245 * local_a40._16_4_;
    auVar21._20_4_ = fVar256 * local_a40._20_4_;
    auVar21._24_4_ = fVar257 * local_a40._24_4_;
    auVar21._28_4_ = auVar125._28_4_;
    auVar136 = vfmsub231ps_fma(auVar21,local_a60,auVar9);
    local_a80 = vpermps_avx2(_DAT_0205d4a0,local_820);
    auVar22._4_4_ = fVar268 * local_a80._4_4_;
    auVar22._0_4_ = fVar267 * local_a80._0_4_;
    auVar22._8_4_ = fVar293 * local_a80._8_4_;
    auVar22._12_4_ = fVar294 * local_a80._12_4_;
    auVar22._16_4_ = fVar295 * local_a80._16_4_;
    auVar22._20_4_ = fVar296 * local_a80._20_4_;
    auVar22._24_4_ = fVar297 * local_a80._24_4_;
    auVar22._28_4_ = 0;
    auVar235 = vfmsub231ps_fma(auVar22,local_a40,auVar123);
    auVar136 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar235._12_4_ * auVar235._12_4_,
                                                  CONCAT48(auVar235._8_4_ * auVar235._8_4_,
                                                           CONCAT44(auVar235._4_4_ * auVar235._4_4_,
                                                                    auVar235._0_4_ * auVar235._0_4_)
                                                          ))),ZEXT1632(auVar136),ZEXT1632(auVar136))
    ;
    fVar233 = local_a60._0_4_;
    auVar249._0_4_ = fVar228 * fVar233;
    fVar241 = local_a60._4_4_;
    auVar249._4_4_ = fVar288 * fVar241;
    fVar211 = local_a60._8_4_;
    auVar249._8_4_ = fVar207 * fVar211;
    fVar227 = local_a60._12_4_;
    auVar249._12_4_ = fVar208 * fVar227;
    fVar286 = local_a60._16_4_;
    auVar249._16_4_ = fVar155 * fVar286;
    fVar231 = local_a60._20_4_;
    auVar249._20_4_ = fVar210 * fVar231;
    fVar255 = local_a60._24_4_;
    auVar249._24_4_ = fVar266 * fVar255;
    auVar249._28_4_ = 0;
    auVar235 = vfmsub231ps_fma(auVar249,local_a80,auVar10);
    auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),ZEXT1632(auVar235),ZEXT1632(auVar235));
    auVar125 = vmaxps_avx(ZEXT1632(CONCAT412(auVar7._12_4_ * auVar111._12_4_,
                                             CONCAT48(auVar7._8_4_ * auVar111._8_4_,
                                                      CONCAT44(auVar7._4_4_ * auVar111._4_4_,
                                                               auVar7._0_4_ * auVar111._0_4_)))),
                          ZEXT1632(CONCAT412(auVar136._12_4_ * auVar111._12_4_,
                                             CONCAT48(auVar136._8_4_ * auVar111._8_4_,
                                                      CONCAT44(auVar136._4_4_ * auVar111._4_4_,
                                                               auVar136._0_4_ * auVar111._0_4_)))));
    local_8e0._0_4_ = auVar262._0_4_ + fVar240;
    local_8e0._4_4_ = auVar262._4_4_ + fVar242;
    local_8e0._8_4_ = auVar262._8_4_ + fVar243;
    local_8e0._12_4_ = auVar262._12_4_ + fVar244;
    local_8e0._16_4_ = fVar197 * 0.0 + 0.0;
    local_8e0._20_4_ = fVar197 * 0.0 + 0.0;
    local_8e0._24_4_ = fVar197 * 0.0 + 0.0;
    local_8e0._28_4_ = fVar99 + 0.0;
    local_800 = ZEXT1632(auVar262);
    auVar222 = vsubps_avx(local_800,auVar13);
    _local_860 = vpermps_avx2(_DAT_0205d4a0,auVar222);
    local_8a0 = vpermps_avx2(_DAT_0205d4a0,local_800);
    auVar222 = vmaxps_avx(local_800,local_8e0);
    auVar219 = vmaxps_avx(_local_860,local_8a0);
    auVar8 = vrsqrtps_avx(ZEXT1632(auVar270));
    auVar222 = vmaxps_avx(auVar222,auVar219);
    fVar197 = auVar8._0_4_;
    fVar99 = auVar8._4_4_;
    fVar240 = auVar8._8_4_;
    fVar242 = auVar8._12_4_;
    fVar243 = auVar8._16_4_;
    fVar244 = auVar8._20_4_;
    fVar224 = auVar8._24_4_;
    auVar23._4_4_ = fVar99 * fVar99 * fVar99 * auVar270._4_4_ * -0.5;
    auVar23._0_4_ = fVar197 * fVar197 * fVar197 * auVar270._0_4_ * -0.5;
    auVar23._8_4_ = fVar240 * fVar240 * fVar240 * auVar270._8_4_ * -0.5;
    auVar23._12_4_ = fVar242 * fVar242 * fVar242 * auVar270._12_4_ * -0.5;
    auVar23._16_4_ = fVar243 * fVar243 * fVar243 * -0.0;
    auVar23._20_4_ = fVar244 * fVar244 * fVar244 * -0.0;
    auVar23._24_4_ = fVar224 * fVar224 * fVar224 * -0.0;
    auVar23._28_4_ = local_a40._28_4_;
    auVar116._8_4_ = 0x3fc00000;
    auVar116._0_8_ = 0x3fc000003fc00000;
    auVar116._12_4_ = 0x3fc00000;
    auVar116._16_4_ = 0x3fc00000;
    auVar116._20_4_ = 0x3fc00000;
    auVar116._24_4_ = 0x3fc00000;
    auVar116._28_4_ = 0x3fc00000;
    auVar111 = vfmadd231ps_fma(auVar23,auVar116,auVar8);
    fVar99 = auVar111._0_4_;
    fVar242 = auVar111._4_4_;
    auVar24._4_4_ = fVar288 * fVar242;
    auVar24._0_4_ = fVar228 * fVar99;
    fVar224 = auVar111._8_4_;
    auVar24._8_4_ = fVar207 * fVar224;
    fVar228 = auVar111._12_4_;
    auVar24._12_4_ = fVar208 * fVar228;
    auVar24._16_4_ = fVar155 * 0.0;
    auVar24._20_4_ = fVar210 * 0.0;
    auVar24._24_4_ = fVar266 * 0.0;
    auVar24._28_4_ = 0;
    auVar25._4_4_ = fVar226 * fVar242 * fStack_61c;
    auVar25._0_4_ = fVar225 * fVar99 * local_620;
    auVar25._8_4_ = fVar229 * fVar224 * fStack_618;
    auVar25._12_4_ = fVar206 * fVar228 * fStack_614;
    auVar25._16_4_ = fVar245 * 0.0 * fStack_610;
    auVar25._20_4_ = fVar256 * 0.0 * fStack_60c;
    auVar25._24_4_ = fVar257 * 0.0 * fStack_608;
    auVar25._28_4_ = auVar10._28_4_;
    auVar111 = vfmadd231ps_fma(auVar25,auVar24,_local_540);
    auVar11 = vsubps_avx(ZEXT832(0) << 0x20,auVar166);
    fVar240 = auVar11._0_4_;
    fVar243 = auVar11._4_4_;
    auVar26._4_4_ = fVar226 * fVar242 * fVar243;
    auVar26._0_4_ = fVar225 * fVar99 * fVar240;
    fVar225 = auVar11._8_4_;
    auVar26._8_4_ = fVar229 * fVar224 * fVar225;
    fVar229 = auVar11._12_4_;
    auVar26._12_4_ = fVar206 * fVar228 * fVar229;
    fVar288 = auVar11._16_4_;
    auVar26._16_4_ = fVar245 * 0.0 * fVar288;
    fVar245 = auVar11._20_4_;
    auVar26._20_4_ = fVar256 * 0.0 * fVar245;
    fVar256 = auVar11._24_4_;
    auVar26._24_4_ = fVar257 * 0.0 * fVar256;
    auVar26._28_4_ = 0;
    auVar12 = vsubps_avx(ZEXT832(0) << 0x20,local_ae0);
    auVar271 = ZEXT3264(auVar12);
    auVar270 = vfmadd231ps_fma(auVar26,auVar12,auVar24);
    auVar27._4_4_ = fVar268 * fVar242;
    auVar27._0_4_ = fVar267 * fVar99;
    auVar27._8_4_ = fVar293 * fVar224;
    auVar27._12_4_ = fVar294 * fVar228;
    auVar27._16_4_ = fVar295 * 0.0;
    auVar27._20_4_ = fVar296 * 0.0;
    auVar27._24_4_ = fVar297 * 0.0;
    auVar27._28_4_ = 0;
    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar27,_local_600);
    auVar274 = ZEXT832(0) << 0x20;
    auVar144 = vsubps_avx(auVar274,local_b00);
    auVar270 = vfmadd231ps_fma(ZEXT1632(auVar270),auVar144,auVar27);
    auVar28._4_4_ = fStack_61c * fVar243;
    auVar28._0_4_ = local_620 * fVar240;
    auVar28._8_4_ = fStack_618 * fVar225;
    auVar28._12_4_ = fStack_614 * fVar229;
    auVar28._16_4_ = fStack_610 * fVar288;
    auVar28._20_4_ = fStack_60c * fVar245;
    auVar28._24_4_ = fStack_608 * fVar256;
    auVar28._28_4_ = 0;
    auVar262 = vfmadd231ps_fma(auVar28,_local_540,auVar12);
    auVar262 = vfmadd231ps_fma(ZEXT1632(auVar262),_local_600,auVar144);
    fVar197 = auVar270._0_4_;
    fVar155 = auVar111._0_4_;
    fVar244 = auVar270._4_4_;
    fVar266 = auVar111._4_4_;
    fVar226 = auVar270._8_4_;
    fVar267 = auVar111._8_4_;
    fVar206 = auVar270._12_4_;
    fVar268 = auVar111._12_4_;
    auVar29._28_4_ = auVar8._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar268 * fVar206,
                            CONCAT48(fVar267 * fVar226,CONCAT44(fVar266 * fVar244,fVar155 * fVar197)
                                    )));
    auVar237 = vsubps_avx(ZEXT1632(auVar262),auVar29);
    auVar30._4_4_ = fVar243 * fVar243;
    auVar30._0_4_ = fVar240 * fVar240;
    auVar30._8_4_ = fVar225 * fVar225;
    auVar30._12_4_ = fVar229 * fVar229;
    auVar30._16_4_ = fVar288 * fVar288;
    auVar30._20_4_ = fVar245 * fVar245;
    auVar30._24_4_ = fVar256 * fVar256;
    auVar30._28_4_ = auVar8._28_4_;
    auVar262 = vfmadd231ps_fma(auVar30,auVar12,auVar12);
    auVar262 = vfmadd231ps_fma(ZEXT1632(auVar262),auVar144,auVar144);
    auVar31._28_4_ = auVar9._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(fVar206 * fVar206,
                            CONCAT48(fVar226 * fVar226,CONCAT44(fVar244 * fVar244,fVar197 * fVar197)
                                    )));
    auVar292 = ZEXT3264(auVar31);
    local_700 = vsubps_avx(ZEXT1632(auVar262),auVar31);
    auVar219 = vsqrtps_avx(auVar125);
    fVar210 = auVar219._28_4_ + auVar222._28_4_;
    fVar197 = (auVar219._0_4_ + auVar222._0_4_) * 1.0000002;
    fVar244 = (auVar219._4_4_ + auVar222._4_4_) * 1.0000002;
    fVar226 = (auVar219._8_4_ + auVar222._8_4_) * 1.0000002;
    fVar206 = (auVar219._12_4_ + auVar222._12_4_) * 1.0000002;
    fVar257 = (auVar219._16_4_ + auVar222._16_4_) * 1.0000002;
    fVar207 = (auVar219._20_4_ + auVar222._20_4_) * 1.0000002;
    fVar208 = (auVar219._24_4_ + auVar222._24_4_) * 1.0000002;
    auVar32._4_4_ = fVar244 * fVar244;
    auVar32._0_4_ = fVar197 * fVar197;
    auVar32._8_4_ = fVar226 * fVar226;
    auVar32._12_4_ = fVar206 * fVar206;
    auVar32._16_4_ = fVar257 * fVar257;
    auVar32._20_4_ = fVar207 * fVar207;
    auVar32._24_4_ = fVar208 * fVar208;
    auVar32._28_4_ = fVar210;
    auVar220._0_4_ = auVar237._0_4_ + auVar237._0_4_;
    auVar220._4_4_ = auVar237._4_4_ + auVar237._4_4_;
    auVar220._8_4_ = auVar237._8_4_ + auVar237._8_4_;
    auVar220._12_4_ = auVar237._12_4_ + auVar237._12_4_;
    auVar220._16_4_ = auVar237._16_4_ + auVar237._16_4_;
    auVar220._20_4_ = auVar237._20_4_ + auVar237._20_4_;
    auVar220._24_4_ = auVar237._24_4_ + auVar237._24_4_;
    auVar220._28_4_ = auVar237._28_4_ + auVar237._28_4_;
    auVar222 = vsubps_avx(local_700,auVar32);
    auVar264 = ZEXT1632(auVar111);
    local_ac0._28_4_ = 0x3f800002;
    local_ac0._0_28_ =
         ZEXT1628(CONCAT412(fVar268 * fVar268,
                            CONCAT48(fVar267 * fVar267,CONCAT44(fVar266 * fVar266,fVar155 * fVar155)
                                    )));
    auVar254 = ZEXT3264(local_200);
    auVar8 = vsubps_avx(local_200,local_ac0);
    local_720._4_4_ = auVar220._4_4_ * auVar220._4_4_;
    local_720._0_4_ = auVar220._0_4_ * auVar220._0_4_;
    fStack_718 = auVar220._8_4_ * auVar220._8_4_;
    fStack_714 = auVar220._12_4_ * auVar220._12_4_;
    fStack_710 = auVar220._16_4_ * auVar220._16_4_;
    fStack_70c = auVar220._20_4_ * auVar220._20_4_;
    fStack_708 = auVar220._24_4_ * auVar220._24_4_;
    fStack_704 = (float)auVar125._28_4_;
    fVar244 = auVar8._0_4_;
    fVar226 = auVar8._4_4_;
    fVar206 = auVar8._8_4_;
    fStack_638 = fVar206 * 4.0;
    fVar257 = auVar8._12_4_;
    fStack_634 = fVar257 * 4.0;
    fVar207 = auVar8._16_4_;
    fStack_630 = fVar207 * 4.0;
    fVar208 = auVar8._20_4_;
    fStack_62c = fVar208 * 4.0;
    fVar155 = auVar8._24_4_;
    fStack_628 = fVar155 * 4.0;
    uStack_624 = 0x40800000;
    auVar33._4_4_ = fVar226 * 4.0 * auVar222._4_4_;
    auVar33._0_4_ = fVar244 * 4.0 * auVar222._0_4_;
    auVar33._8_4_ = fStack_638 * auVar222._8_4_;
    auVar33._12_4_ = fStack_634 * auVar222._12_4_;
    auVar33._16_4_ = fStack_630 * auVar222._16_4_;
    auVar33._20_4_ = fStack_62c * auVar222._20_4_;
    auVar33._24_4_ = fStack_628 * auVar222._24_4_;
    auVar33._28_4_ = fVar210;
    auVar237 = vsubps_avx(_local_720,auVar33);
    auVar125 = vcmpps_avx(auVar237,auVar274,5);
    auVar300 = ZEXT1632(auVar270);
    fVar197 = auVar8._28_4_;
    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar125 >> 0x7f,0) == '\0') &&
          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar125 >> 0xbf,0) == '\0') &&
        (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar125[0x1f])
    {
      auVar239 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar260._8_4_ = 0xff800000;
      auVar260._0_8_ = 0xff800000ff800000;
      auVar260._12_4_ = 0xff800000;
      auVar260._16_4_ = 0xff800000;
      auVar260._20_4_ = 0xff800000;
      auVar260._24_4_ = 0xff800000;
      auVar260._28_4_ = 0xff800000;
    }
    else {
      auVar6 = vcmpps_avx(auVar237,auVar274,5);
      auVar254 = ZEXT3264(auVar6);
      auVar274 = vsqrtps_avx(auVar237);
      auVar289._0_4_ = fVar244 + fVar244;
      auVar289._4_4_ = fVar226 + fVar226;
      auVar289._8_4_ = fVar206 + fVar206;
      auVar289._12_4_ = fVar257 + fVar257;
      auVar289._16_4_ = fVar207 + fVar207;
      auVar289._20_4_ = fVar208 + fVar208;
      auVar289._24_4_ = fVar155 + fVar155;
      auVar289._28_4_ = fVar197 + fVar197;
      auVar237 = vrcpps_avx(auVar289);
      auVar117._8_4_ = 0x3f800000;
      auVar117._0_8_ = &DAT_3f8000003f800000;
      auVar117._12_4_ = 0x3f800000;
      auVar117._16_4_ = 0x3f800000;
      auVar117._20_4_ = 0x3f800000;
      auVar117._24_4_ = 0x3f800000;
      auVar117._28_4_ = 0x3f800000;
      auVar111 = vfnmadd213ps_fma(auVar289,auVar237,auVar117);
      auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar237,auVar237);
      auVar275._0_4_ = (uint)auVar220._0_4_ ^ local_6c0;
      auVar275._4_4_ = (uint)auVar220._4_4_ ^ uStack_6bc;
      auVar275._8_4_ = (uint)auVar220._8_4_ ^ uStack_6b8;
      auVar275._12_4_ = (uint)auVar220._12_4_ ^ uStack_6b4;
      auVar275._16_4_ = (uint)auVar220._16_4_ ^ (uint)fStack_6b0;
      auVar275._20_4_ = (uint)auVar220._20_4_ ^ (uint)fStack_6ac;
      auVar275._24_4_ = (uint)auVar220._24_4_ ^ (uint)fStack_6a8;
      auVar275._28_4_ = (uint)auVar220._28_4_ ^ uStack_6a4;
      auVar237 = vsubps_avx(auVar275,auVar274);
      auVar34._4_4_ = auVar237._4_4_ * auVar111._4_4_;
      auVar34._0_4_ = auVar237._0_4_ * auVar111._0_4_;
      auVar34._8_4_ = auVar237._8_4_ * auVar111._8_4_;
      auVar34._12_4_ = auVar237._12_4_ * auVar111._12_4_;
      auVar34._16_4_ = auVar237._16_4_ * 0.0;
      auVar34._20_4_ = auVar237._20_4_ * 0.0;
      auVar34._24_4_ = auVar237._24_4_ * 0.0;
      auVar34._28_4_ = auVar237._28_4_;
      auVar237 = vsubps_avx(auVar274,auVar220);
      auVar35._4_4_ = auVar111._4_4_ * auVar237._4_4_;
      auVar35._0_4_ = auVar111._0_4_ * auVar237._0_4_;
      auVar35._8_4_ = auVar111._8_4_ * auVar237._8_4_;
      auVar35._12_4_ = auVar111._12_4_ * auVar237._12_4_;
      auVar35._16_4_ = auVar237._16_4_ * 0.0;
      auVar35._20_4_ = auVar237._20_4_ * 0.0;
      auVar35._24_4_ = auVar237._24_4_ * 0.0;
      auVar35._28_4_ = auVar237._28_4_;
      auVar111 = vfmadd213ps_fma(auVar264,auVar34,auVar300);
      local_500 = ZEXT1632(CONCAT412(auVar111._12_4_ * fVar228,
                                     CONCAT48(auVar111._8_4_ * fVar224,
                                              CONCAT44(auVar111._4_4_ * fVar242,
                                                       auVar111._0_4_ * fVar99))));
      auVar111 = vfmadd213ps_fma(auVar264,auVar35,auVar300);
      local_520 = ZEXT1632(CONCAT412(auVar111._12_4_ * fVar228,
                                     CONCAT48(auVar111._8_4_ * fVar224,
                                              CONCAT44(auVar111._4_4_ * fVar242,
                                                       auVar111._0_4_ * fVar99))));
      auVar118._8_4_ = 0x7f800000;
      auVar118._0_8_ = 0x7f8000007f800000;
      auVar118._12_4_ = 0x7f800000;
      auVar118._16_4_ = 0x7f800000;
      auVar118._20_4_ = 0x7f800000;
      auVar118._24_4_ = 0x7f800000;
      auVar118._28_4_ = 0x7f800000;
      auVar274 = vblendvps_avx(auVar118,auVar34,auVar6);
      auVar66._4_4_ = uStack_75c;
      auVar66._0_4_ = local_760;
      auVar66._8_4_ = uStack_758;
      auVar66._12_4_ = uStack_754;
      auVar66._16_4_ = uStack_750;
      auVar66._20_4_ = uStack_74c;
      auVar66._24_4_ = uStack_748;
      auVar66._28_4_ = uStack_744;
      auVar237 = vandps_avx(auVar66,local_ac0);
      auVar237 = vmaxps_avx(local_440,auVar237);
      auVar36._4_4_ = auVar237._4_4_ * 1.9073486e-06;
      auVar36._0_4_ = auVar237._0_4_ * 1.9073486e-06;
      auVar36._8_4_ = auVar237._8_4_ * 1.9073486e-06;
      auVar36._12_4_ = auVar237._12_4_ * 1.9073486e-06;
      auVar36._16_4_ = auVar237._16_4_ * 1.9073486e-06;
      auVar36._20_4_ = auVar237._20_4_ * 1.9073486e-06;
      auVar36._24_4_ = auVar237._24_4_ * 1.9073486e-06;
      auVar36._28_4_ = auVar237._28_4_;
      auVar237 = vandps_avx(auVar66,auVar8);
      auVar237 = vcmpps_avx(auVar237,auVar36,1);
      auVar292 = ZEXT3264(auVar237);
      auVar119._8_4_ = 0xff800000;
      auVar119._0_8_ = 0xff800000ff800000;
      auVar119._12_4_ = 0xff800000;
      auVar119._16_4_ = 0xff800000;
      auVar119._20_4_ = 0xff800000;
      auVar119._24_4_ = 0xff800000;
      auVar119._28_4_ = 0xff800000;
      auVar260 = vblendvps_avx(auVar119,auVar35,auVar6);
      auVar13 = auVar6 & auVar237;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar13 >> 0x7f,0) == '\0') &&
            (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar13 >> 0xbf,0) == '\0') &&
          (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar13[0x1f])
      {
        auVar239 = ZEXT3264(auVar274);
      }
      else {
        auVar125 = vandps_avx(auVar237,auVar6);
        auVar13 = vcmpps_avx(auVar222,_DAT_02020f00,2);
        auVar128._8_4_ = 0xff800000;
        auVar128._0_8_ = 0xff800000ff800000;
        auVar128._12_4_ = 0xff800000;
        auVar128._16_4_ = 0xff800000;
        auVar128._20_4_ = 0xff800000;
        auVar128._24_4_ = 0xff800000;
        auVar128._28_4_ = 0xff800000;
        auVar290._8_4_ = 0x7f800000;
        auVar290._0_8_ = 0x7f8000007f800000;
        auVar290._12_4_ = 0x7f800000;
        auVar290._16_4_ = 0x7f800000;
        auVar290._20_4_ = 0x7f800000;
        auVar290._24_4_ = 0x7f800000;
        auVar290._28_4_ = 0x7f800000;
        auVar292 = ZEXT3264(auVar290);
        auVar222 = vblendvps_avx(auVar290,auVar128,auVar13);
        auVar111 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
        auVar14 = vpmovsxwd_avx2(auVar111);
        auVar222 = vblendvps_avx(auVar274,auVar222,auVar14);
        auVar237 = vblendvps_avx(auVar128,auVar290,auVar13);
        auVar260 = vblendvps_avx(auVar260,auVar237,auVar14);
        auVar239 = ZEXT3264(auVar222);
        auVar205._0_8_ = auVar125._0_8_ ^ 0xffffffffffffffff;
        auVar205._8_4_ = auVar125._8_4_ ^ 0xffffffff;
        auVar205._12_4_ = auVar125._12_4_ ^ 0xffffffff;
        auVar205._16_4_ = auVar125._16_4_ ^ 0xffffffff;
        auVar205._20_4_ = auVar125._20_4_ ^ 0xffffffff;
        auVar205._24_4_ = auVar125._24_4_ ^ 0xffffffff;
        auVar205._28_4_ = auVar125._28_4_ ^ 0xffffffff;
        auVar125 = vorps_avx(auVar13,auVar205);
        auVar125 = vandps_avx(auVar6,auVar125);
      }
    }
    auVar222 = local_420 & auVar125;
    auVar280 = ZEXT3264(_local_600);
    fVar210 = (float)local_a20._0_4_;
    fVar266 = (float)local_a20._4_4_;
    fVar267 = fStack_a18;
    fVar268 = fStack_a14;
    fVar293 = fStack_a10;
    fVar294 = fStack_a0c;
    fVar295 = fStack_a08;
    fVar296 = fStack_a04;
    if ((((((((auVar222 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar222 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar222 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar222 >> 0x7f,0) != '\0') ||
          (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar222 >> 0xbf,0) != '\0') ||
        (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar222[0x1f] < '\0') {
      fVar297 = (ray->org).field_0.m128[3] - (float)local_7b0._0_4_;
      auVar193._4_4_ = fVar297;
      auVar193._0_4_ = fVar297;
      auVar193._8_4_ = fVar297;
      auVar193._12_4_ = fVar297;
      auVar193._16_4_ = fVar297;
      auVar193._20_4_ = fVar297;
      auVar193._24_4_ = fVar297;
      auVar193._28_4_ = fVar297;
      auVar237 = vmaxps_avx(auVar193,auVar239._0_32_);
      auVar37._4_4_ = fVar243 * fVar281;
      auVar37._0_4_ = fVar240 * fVar272;
      auVar37._8_4_ = fVar225 * fVar282;
      auVar37._12_4_ = fVar229 * fVar283;
      auVar37._16_4_ = fVar288 * fVar284;
      auVar37._20_4_ = fVar245 * fVar285;
      auVar37._24_4_ = fVar256 * fVar287;
      auVar37._28_4_ = auVar11._28_4_;
      auVar111 = vfmadd213ps_fma(auVar12,local_820,auVar37);
      fVar240 = ray->tfar - (float)local_7b0._0_4_;
      auVar194._4_4_ = fVar240;
      auVar194._0_4_ = fVar240;
      auVar194._8_4_ = fVar240;
      auVar194._12_4_ = fVar240;
      auVar194._16_4_ = fVar240;
      auVar194._20_4_ = fVar240;
      auVar194._24_4_ = fVar240;
      auVar194._28_4_ = fVar240;
      auVar270 = vfmadd213ps_fma(auVar144,auVar18,ZEXT1632(auVar111));
      auVar38._4_4_ = fVar281 * fStack_61c;
      auVar38._0_4_ = fVar272 * local_620;
      auVar38._8_4_ = fVar282 * fStack_618;
      auVar38._12_4_ = fVar283 * fStack_614;
      auVar38._16_4_ = fVar284 * fStack_610;
      auVar38._20_4_ = fVar285 * fStack_60c;
      auVar38._24_4_ = fVar287 * fStack_608;
      auVar38._28_4_ = fVar209 + fVar209;
      auVar111 = vfmadd231ps_fma(auVar38,_local_540,local_820);
      auVar262 = vfmadd231ps_fma(ZEXT1632(auVar111),_local_600,auVar18);
      auVar67._4_4_ = uStack_75c;
      auVar67._0_4_ = local_760;
      auVar67._8_4_ = uStack_758;
      auVar67._12_4_ = uStack_754;
      auVar67._16_4_ = uStack_750;
      auVar67._20_4_ = uStack_74c;
      auVar67._24_4_ = uStack_748;
      auVar67._28_4_ = uStack_744;
      auVar222 = vandps_avx(ZEXT1632(auVar262),auVar67);
      auVar120._8_4_ = 0x219392ef;
      auVar120._0_8_ = 0x219392ef219392ef;
      auVar120._12_4_ = 0x219392ef;
      auVar120._16_4_ = 0x219392ef;
      auVar120._20_4_ = 0x219392ef;
      auVar120._24_4_ = 0x219392ef;
      auVar120._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar222,auVar120,1);
      auVar222 = vrcpps_avx(ZEXT1632(auVar262));
      auVar168._8_4_ = 0x3f800000;
      auVar168._0_8_ = &DAT_3f8000003f800000;
      auVar168._12_4_ = 0x3f800000;
      auVar168._16_4_ = 0x3f800000;
      auVar168._20_4_ = 0x3f800000;
      auVar168._24_4_ = 0x3f800000;
      auVar168._28_4_ = 0x3f800000;
      auVar144 = ZEXT1632(auVar262);
      auVar111 = vfnmadd213ps_fma(auVar222,auVar144,auVar168);
      auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar222,auVar222);
      auVar276._0_4_ = auVar262._0_4_ ^ local_6c0;
      auVar276._4_4_ = auVar262._4_4_ ^ uStack_6bc;
      auVar276._8_4_ = auVar262._8_4_ ^ uStack_6b8;
      auVar276._12_4_ = auVar262._12_4_ ^ uStack_6b4;
      auVar276._16_4_ = fStack_6b0;
      auVar276._20_4_ = fStack_6ac;
      auVar276._24_4_ = fStack_6a8;
      auVar276._28_4_ = uStack_6a4;
      auVar39._4_4_ = auVar111._4_4_ * (float)(auVar270._4_4_ ^ uStack_6bc);
      auVar39._0_4_ = auVar111._0_4_ * (float)(auVar270._0_4_ ^ local_6c0);
      auVar39._8_4_ = auVar111._8_4_ * (float)(auVar270._8_4_ ^ uStack_6b8);
      auVar39._12_4_ = auVar111._12_4_ * (float)(auVar270._12_4_ ^ uStack_6b4);
      auVar39._16_4_ = fStack_6b0 * 0.0;
      auVar39._20_4_ = fStack_6ac * 0.0;
      auVar39._24_4_ = fStack_6a8 * 0.0;
      auVar39._28_4_ = uStack_6a4;
      auVar222 = vcmpps_avx(auVar144,auVar276,1);
      auVar222 = vorps_avx(auVar11,auVar222);
      auVar301._8_4_ = 0xff800000;
      auVar301._0_8_ = 0xff800000ff800000;
      auVar301._12_4_ = 0xff800000;
      auVar301._16_4_ = 0xff800000;
      auVar301._20_4_ = 0xff800000;
      auVar301._24_4_ = 0xff800000;
      auVar301._28_4_ = 0xff800000;
      auVar222 = vblendvps_avx(auVar39,auVar301,auVar222);
      auVar12 = vminps_avx(auVar194,auVar260);
      _local_940 = vmaxps_avx(auVar237,auVar222);
      auVar222 = vcmpps_avx(auVar144,auVar276,6);
      auVar222 = vorps_avx(auVar11,auVar222);
      auVar236._8_4_ = 0x7f800000;
      auVar236._0_8_ = 0x7f8000007f800000;
      auVar236._12_4_ = 0x7f800000;
      auVar236._16_4_ = 0x7f800000;
      auVar236._20_4_ = 0x7f800000;
      auVar236._24_4_ = 0x7f800000;
      auVar236._28_4_ = 0x7f800000;
      auVar222 = vblendvps_avx(auVar39,auVar236,auVar222);
      auVar12 = vminps_avx(auVar12,auVar222);
      auVar222 = vsubps_avx(ZEXT832(0) << 0x20,auVar16);
      auVar11 = vsubps_avx(ZEXT832(0) << 0x20,_local_7e0);
      auVar40._4_4_ = auVar11._4_4_ * fVar241;
      auVar40._0_4_ = auVar11._0_4_ * fVar233;
      auVar40._8_4_ = auVar11._8_4_ * fVar211;
      auVar40._12_4_ = auVar11._12_4_ * fVar227;
      auVar40._16_4_ = auVar11._16_4_ * fVar286;
      auVar40._20_4_ = auVar11._20_4_ * fVar231;
      auVar40._24_4_ = auVar11._24_4_ * fVar255;
      auVar40._28_4_ = auVar11._28_4_;
      auVar111 = vfnmsub231ps_fma(auVar40,local_a80,auVar222);
      auVar222 = vsubps_avx(ZEXT832(0) << 0x20,auVar15);
      auVar270 = vfnmadd231ps_fma(ZEXT1632(auVar111),local_a40,auVar222);
      auVar41._4_4_ = fVar241 * fStack_61c;
      auVar41._0_4_ = fVar233 * local_620;
      auVar41._8_4_ = fVar211 * fStack_618;
      auVar41._12_4_ = fVar227 * fStack_614;
      auVar41._16_4_ = fVar286 * fStack_610;
      auVar41._20_4_ = fVar231 * fStack_60c;
      auVar41._24_4_ = fVar255 * fStack_608;
      auVar41._28_4_ = auVar222._28_4_;
      auVar111 = vfnmsub231ps_fma(auVar41,_local_540,local_a80);
      auVar262 = vfnmadd231ps_fma(ZEXT1632(auVar111),local_a40,_local_600);
      auVar239 = ZEXT1664(auVar262);
      auVar222 = vandps_avx(ZEXT1632(auVar262),auVar67);
      auVar144 = vrcpps_avx(ZEXT1632(auVar262));
      auVar221._8_4_ = 0x219392ef;
      auVar221._0_8_ = 0x219392ef219392ef;
      auVar221._12_4_ = 0x219392ef;
      auVar221._16_4_ = 0x219392ef;
      auVar221._20_4_ = 0x219392ef;
      auVar221._24_4_ = 0x219392ef;
      auVar221._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar222,auVar221,1);
      auVar271 = ZEXT3264(auVar11);
      auVar237 = ZEXT1632(auVar262);
      auVar111 = vfnmadd213ps_fma(auVar144,auVar237,auVar168);
      auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar144,auVar144);
      auVar277._0_4_ = auVar262._0_4_ ^ local_6c0;
      auVar277._4_4_ = auVar262._4_4_ ^ uStack_6bc;
      auVar277._8_4_ = auVar262._8_4_ ^ uStack_6b8;
      auVar277._12_4_ = auVar262._12_4_ ^ uStack_6b4;
      auVar277._16_4_ = fStack_6b0;
      auVar277._20_4_ = fStack_6ac;
      auVar277._24_4_ = fStack_6a8;
      auVar277._28_4_ = uStack_6a4;
      auVar280 = ZEXT3264(auVar277);
      auVar42._4_4_ = auVar111._4_4_ * (float)(auVar270._4_4_ ^ uStack_6bc);
      auVar42._0_4_ = auVar111._0_4_ * (float)(auVar270._0_4_ ^ local_6c0);
      auVar42._8_4_ = auVar111._8_4_ * (float)(auVar270._8_4_ ^ uStack_6b8);
      auVar42._12_4_ = auVar111._12_4_ * (float)(auVar270._12_4_ ^ uStack_6b4);
      auVar42._16_4_ = fStack_6b0 * 0.0;
      auVar42._20_4_ = fStack_6ac * 0.0;
      auVar42._24_4_ = fStack_6a8 * 0.0;
      auVar42._28_4_ = uStack_6a4;
      auVar254 = ZEXT3264(auVar42);
      auVar222 = vcmpps_avx(auVar237,auVar277,1);
      auVar222 = vorps_avx(auVar11,auVar222);
      auVar121._8_4_ = 0xff800000;
      auVar121._0_8_ = 0xff800000ff800000;
      auVar121._12_4_ = 0xff800000;
      auVar121._16_4_ = 0xff800000;
      auVar121._20_4_ = 0xff800000;
      auVar121._24_4_ = 0xff800000;
      auVar121._28_4_ = 0xff800000;
      auVar222 = vblendvps_avx(auVar42,auVar121,auVar222);
      _local_8c0 = vmaxps_avx(_local_940,auVar222);
      auVar292 = ZEXT3264(_local_8c0);
      auVar222 = vcmpps_avx(auVar237,auVar277,6);
      auVar222 = vorps_avx(auVar11,auVar222);
      auVar122._8_4_ = 0x7f800000;
      auVar122._0_8_ = 0x7f8000007f800000;
      auVar122._12_4_ = 0x7f800000;
      auVar122._16_4_ = 0x7f800000;
      auVar122._20_4_ = 0x7f800000;
      auVar122._24_4_ = 0x7f800000;
      auVar122._28_4_ = 0x7f800000;
      auVar222 = vblendvps_avx(auVar42,auVar122,auVar222);
      auVar125 = vandps_avx(auVar125,local_420);
      local_a00 = vminps_avx(auVar12,auVar222);
      auVar222 = vcmpps_avx(_local_8c0,local_a00,2);
      auVar11 = auVar125 & auVar222;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar11 = vminps_avx(local_500,auVar168);
        auVar59 = ZEXT412(0);
        auVar280 = ZEXT1264(auVar59) << 0x20;
        auVar11 = vmaxps_avx(auVar11,ZEXT1232(auVar59) << 0x20);
        auVar12 = vminps_avx(local_520,auVar168);
        auVar12 = vmaxps_avx(auVar12,ZEXT1232(auVar59) << 0x20);
        auVar43._4_4_ = (auVar11._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar11._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar11._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar11._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar11._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar11._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar11._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar11._28_4_ + 7.0;
        auVar111 = vfmadd213ps_fma(auVar43,local_960,local_6e0);
        auVar44._4_4_ = (auVar12._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar12._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar12._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar12._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar12._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar12._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar12._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar12._28_4_ + 7.0;
        auVar270 = vfmadd213ps_fma(auVar44,local_960,local_6e0);
        auVar11 = vminps_avx(local_800,local_8e0);
        auVar12 = vminps_avx(_local_860,local_8a0);
        auVar11 = vminps_avx(auVar11,auVar12);
        auVar11 = vsubps_avx(auVar11,auVar219);
        auVar125 = vandps_avx(auVar222,auVar125);
        local_500 = ZEXT1632(auVar111);
        local_520 = ZEXT1632(auVar270);
        auVar45._4_4_ = auVar11._4_4_ * 0.99999976;
        auVar45._0_4_ = auVar11._0_4_ * 0.99999976;
        auVar45._8_4_ = auVar11._8_4_ * 0.99999976;
        auVar45._12_4_ = auVar11._12_4_ * 0.99999976;
        auVar45._16_4_ = auVar11._16_4_ * 0.99999976;
        auVar45._20_4_ = auVar11._20_4_ * 0.99999976;
        auVar45._24_4_ = auVar11._24_4_ * 0.99999976;
        auVar45._28_4_ = auVar11._28_4_;
        auVar222 = vmaxps_avx(ZEXT832(0) << 0x20,auVar45);
        auVar46._4_4_ = auVar222._4_4_ * auVar222._4_4_;
        auVar46._0_4_ = auVar222._0_4_ * auVar222._0_4_;
        auVar46._8_4_ = auVar222._8_4_ * auVar222._8_4_;
        auVar46._12_4_ = auVar222._12_4_ * auVar222._12_4_;
        auVar46._16_4_ = auVar222._16_4_ * auVar222._16_4_;
        auVar46._20_4_ = auVar222._20_4_ * auVar222._20_4_;
        auVar46._24_4_ = auVar222._24_4_ * auVar222._24_4_;
        auVar46._28_4_ = auVar222._28_4_;
        auVar11 = vsubps_avx(local_700,auVar46);
        auVar47._4_4_ = auVar11._4_4_ * fVar226 * 4.0;
        auVar47._0_4_ = auVar11._0_4_ * fVar244 * 4.0;
        auVar47._8_4_ = auVar11._8_4_ * fStack_638;
        auVar47._12_4_ = auVar11._12_4_ * fStack_634;
        auVar47._16_4_ = auVar11._16_4_ * fStack_630;
        auVar47._20_4_ = auVar11._20_4_ * fStack_62c;
        auVar47._24_4_ = auVar11._24_4_ * fStack_628;
        auVar47._28_4_ = auVar222._28_4_;
        auVar12 = vsubps_avx(_local_720,auVar47);
        auVar271 = ZEXT3264(auVar12);
        local_880 = vcmpps_avx(auVar12,ZEXT1232(auVar59) << 0x20,5);
        auVar222 = local_880;
        if ((((((((local_880 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_880 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_880 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_880 >> 0x7f,0) == '\0') &&
              (local_880 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_880 >> 0xbf,0) == '\0') &&
            (local_880 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_880[0x1f]) {
          auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
          local_680 = ZEXT832(0) << 0x20;
          _local_6a0 = ZEXT832(0) << 0x20;
          auVar144 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar174 = ZEXT864(0) << 0x20;
          auVar238._8_4_ = 0x7f800000;
          auVar238._0_8_ = 0x7f8000007f800000;
          auVar238._12_4_ = 0x7f800000;
          auVar238._16_4_ = 0x7f800000;
          auVar238._20_4_ = 0x7f800000;
          auVar238._24_4_ = 0x7f800000;
          auVar238._28_4_ = 0x7f800000;
          auVar254 = ZEXT3264(CONCAT428(0xff800000,
                                        CONCAT424(0xff800000,
                                                  CONCAT420(0xff800000,
                                                            CONCAT416(0xff800000,
                                                                      CONCAT412(0xff800000,
                                                                                CONCAT48(0xff800000,
                                                                                                                                                                                  
                                                  0xff800000ff800000)))))));
          local_880 = auVar16;
          local_660 = local_680;
        }
        else {
          auVar237 = vsqrtps_avx(auVar12);
          auVar250._0_4_ = fVar244 + fVar244;
          auVar250._4_4_ = fVar226 + fVar226;
          auVar250._8_4_ = fVar206 + fVar206;
          auVar250._12_4_ = fVar257 + fVar257;
          auVar250._16_4_ = fVar207 + fVar207;
          auVar250._20_4_ = fVar208 + fVar208;
          auVar250._24_4_ = fVar155 + fVar155;
          auVar250._28_4_ = fVar197 + fVar197;
          auVar144 = vrcpps_avx(auVar250);
          auVar111 = vfnmadd213ps_fma(auVar250,auVar144,auVar168);
          auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar144,auVar144);
          auVar278._0_4_ = (uint)auVar220._0_4_ ^ local_6c0;
          auVar278._4_4_ = (uint)auVar220._4_4_ ^ uStack_6bc;
          auVar278._8_4_ = (uint)auVar220._8_4_ ^ uStack_6b8;
          auVar278._12_4_ = (uint)auVar220._12_4_ ^ uStack_6b4;
          auVar278._16_4_ = (uint)auVar220._16_4_ ^ (uint)fStack_6b0;
          auVar278._20_4_ = (uint)auVar220._20_4_ ^ (uint)fStack_6ac;
          auVar278._24_4_ = (uint)auVar220._24_4_ ^ (uint)fStack_6a8;
          auVar278._28_4_ = (uint)auVar220._28_4_ ^ uStack_6a4;
          auVar144 = vsubps_avx(auVar278,auVar237);
          auVar15 = vsubps_avx(auVar237,auVar220);
          fVar197 = auVar144._0_4_ * auVar111._0_4_;
          fVar233 = auVar144._4_4_ * auVar111._4_4_;
          auVar48._4_4_ = fVar233;
          auVar48._0_4_ = fVar197;
          fVar240 = auVar144._8_4_ * auVar111._8_4_;
          auVar48._8_4_ = fVar240;
          fVar241 = auVar144._12_4_ * auVar111._12_4_;
          auVar48._12_4_ = fVar241;
          fVar243 = auVar144._16_4_ * 0.0;
          auVar48._16_4_ = fVar243;
          fVar244 = auVar144._20_4_ * 0.0;
          auVar48._20_4_ = fVar244;
          fVar211 = auVar144._24_4_ * 0.0;
          auVar48._24_4_ = fVar211;
          auVar48._28_4_ = auVar237._28_4_;
          fVar225 = auVar15._0_4_ * auVar111._0_4_;
          fVar226 = auVar15._4_4_ * auVar111._4_4_;
          auVar49._4_4_ = fVar226;
          auVar49._0_4_ = fVar225;
          fVar227 = auVar15._8_4_ * auVar111._8_4_;
          auVar49._8_4_ = fVar227;
          fVar229 = auVar15._12_4_ * auVar111._12_4_;
          auVar49._12_4_ = fVar229;
          fVar206 = auVar15._16_4_ * 0.0;
          auVar49._16_4_ = fVar206;
          fVar286 = auVar15._20_4_ * 0.0;
          auVar49._20_4_ = fVar286;
          fVar288 = auVar15._24_4_ * 0.0;
          auVar49._24_4_ = fVar288;
          auVar49._28_4_ = auVar144._28_4_;
          auVar280 = ZEXT3264(auVar49);
          auVar111 = vfmadd213ps_fma(auVar264,auVar48,auVar300);
          auVar270 = vfmadd213ps_fma(auVar264,auVar49,auVar300);
          auVar144 = ZEXT1632(CONCAT412(auVar111._12_4_ * fVar228,
                                        CONCAT48(auVar111._8_4_ * fVar224,
                                                 CONCAT44(auVar111._4_4_ * fVar242,
                                                          auVar111._0_4_ * fVar99))));
          auVar50._28_4_ = local_a60._28_4_;
          auVar50._0_28_ =
               ZEXT1628(CONCAT412(auVar270._12_4_ * fVar228,
                                  CONCAT48(auVar270._8_4_ * fVar224,
                                           CONCAT44(auVar270._4_4_ * fVar242,auVar270._0_4_ * fVar99
                                                   ))));
          auVar111 = vfmadd213ps_fma(auVar9,auVar144,local_b00);
          auVar270 = vfmadd213ps_fma(auVar9,auVar50,local_b00);
          auVar262 = vfmadd213ps_fma(auVar123,auVar144,local_ae0);
          auVar7 = vfmadd213ps_fma(auVar123,auVar50,local_ae0);
          auVar136 = vfmadd213ps_fma(auVar144,auVar10,auVar166);
          auVar235 = vfmadd213ps_fma(auVar10,auVar50,auVar166);
          auVar51._4_4_ = (float)local_600._4_4_ * fVar233;
          auVar51._0_4_ = (float)local_600._0_4_ * fVar197;
          auVar51._8_4_ = fStack_5f8 * fVar240;
          auVar51._12_4_ = fStack_5f4 * fVar241;
          auVar51._16_4_ = fStack_5f0 * fVar243;
          auVar51._20_4_ = fStack_5ec * fVar244;
          auVar51._24_4_ = fStack_5e8 * fVar211;
          auVar51._28_4_ = 0;
          auVar123 = vsubps_avx(auVar51,ZEXT1632(auVar111));
          auVar52._4_4_ = (float)local_540._4_4_ * fVar233;
          auVar52._0_4_ = (float)local_540._0_4_ * fVar197;
          auVar52._8_4_ = fStack_538 * fVar240;
          auVar52._12_4_ = fStack_534 * fVar241;
          auVar52._16_4_ = fStack_530 * fVar243;
          auVar52._20_4_ = fStack_52c * fVar244;
          auVar52._24_4_ = fStack_528 * fVar211;
          auVar52._28_4_ = local_540._28_4_;
          auVar144 = vsubps_avx(auVar52,ZEXT1632(auVar262));
          auVar169._0_4_ = local_620 * fVar197;
          auVar169._4_4_ = fStack_61c * fVar233;
          auVar169._8_4_ = fStack_618 * fVar240;
          auVar169._12_4_ = fStack_614 * fVar241;
          auVar169._16_4_ = fStack_610 * fVar243;
          auVar169._20_4_ = fStack_60c * fVar244;
          auVar169._24_4_ = fStack_608 * fVar211;
          auVar169._28_4_ = 0;
          auVar9 = vsubps_avx(auVar169,ZEXT1632(auVar136));
          auVar174 = ZEXT3264(auVar9);
          auVar251._0_4_ = (float)local_600._0_4_ * fVar225;
          auVar251._4_4_ = (float)local_600._4_4_ * fVar226;
          auVar251._8_4_ = fStack_5f8 * fVar227;
          auVar251._12_4_ = fStack_5f4 * fVar229;
          auVar251._16_4_ = fStack_5f0 * fVar206;
          auVar251._20_4_ = fStack_5ec * fVar286;
          auVar251._24_4_ = fStack_5e8 * fVar288;
          auVar251._28_4_ = 0;
          local_660 = vsubps_avx(auVar251,ZEXT1632(auVar270));
          auVar53._4_4_ = (float)local_540._4_4_ * fVar226;
          auVar53._0_4_ = (float)local_540._0_4_ * fVar225;
          auVar53._8_4_ = fStack_538 * fVar227;
          auVar53._12_4_ = fStack_534 * fVar229;
          auVar53._16_4_ = fStack_530 * fVar206;
          auVar53._20_4_ = fStack_52c * fVar286;
          auVar53._24_4_ = fStack_528 * fVar288;
          auVar53._28_4_ = local_660._28_4_;
          local_680 = vsubps_avx(auVar53,ZEXT1632(auVar7));
          auVar54._4_4_ = fStack_61c * fVar226;
          auVar54._0_4_ = local_620 * fVar225;
          auVar54._8_4_ = fStack_618 * fVar227;
          auVar54._12_4_ = fStack_614 * fVar229;
          auVar54._16_4_ = fStack_610 * fVar206;
          auVar54._20_4_ = fStack_60c * fVar286;
          auVar54._24_4_ = fStack_608 * fVar288;
          auVar54._28_4_ = local_680._28_4_;
          _local_6a0 = vsubps_avx(auVar54,ZEXT1632(auVar235));
          auVar10 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,5);
          auVar252._8_4_ = 0x7f800000;
          auVar252._0_8_ = 0x7f8000007f800000;
          auVar252._12_4_ = 0x7f800000;
          auVar252._16_4_ = 0x7f800000;
          auVar252._20_4_ = 0x7f800000;
          auVar252._24_4_ = 0x7f800000;
          auVar252._28_4_ = 0x7f800000;
          auVar238 = vblendvps_avx(auVar252,auVar48,auVar10);
          auVar68._4_4_ = uStack_75c;
          auVar68._0_4_ = local_760;
          auVar68._8_4_ = uStack_758;
          auVar68._12_4_ = uStack_754;
          auVar68._16_4_ = uStack_750;
          auVar68._20_4_ = uStack_74c;
          auVar68._24_4_ = uStack_748;
          auVar68._28_4_ = uStack_744;
          auVar9 = vandps_avx(auVar68,local_ac0);
          auVar9 = vmaxps_avx(local_440,auVar9);
          auVar271 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar55._4_4_ = auVar9._4_4_ * 1.9073486e-06;
          auVar55._0_4_ = auVar9._0_4_ * 1.9073486e-06;
          auVar55._8_4_ = auVar9._8_4_ * 1.9073486e-06;
          auVar55._12_4_ = auVar9._12_4_ * 1.9073486e-06;
          auVar55._16_4_ = auVar9._16_4_ * 1.9073486e-06;
          auVar55._20_4_ = auVar9._20_4_ * 1.9073486e-06;
          auVar55._24_4_ = auVar9._24_4_ * 1.9073486e-06;
          auVar55._28_4_ = auVar9._28_4_;
          auVar8 = vandps_avx(auVar68,auVar8);
          auVar9 = vcmpps_avx(auVar8,auVar55,1);
          auVar253._8_4_ = 0xff800000;
          auVar253._0_8_ = 0xff800000ff800000;
          auVar253._12_4_ = 0xff800000;
          auVar253._16_4_ = 0xff800000;
          auVar253._20_4_ = 0xff800000;
          auVar253._24_4_ = 0xff800000;
          auVar253._28_4_ = 0xff800000;
          auVar8 = vblendvps_avx(auVar253,auVar49,auVar10);
          auVar254 = ZEXT3264(auVar8);
          auVar12 = auVar10 & auVar9;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0x7f,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0xbf,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar12[0x1f] < '\0') {
            auVar222 = vandps_avx(auVar9,auVar10);
            auVar11 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,2);
            auVar279._8_4_ = 0xff800000;
            auVar279._0_8_ = 0xff800000ff800000;
            auVar279._12_4_ = 0xff800000;
            auVar279._16_4_ = 0xff800000;
            auVar279._20_4_ = 0xff800000;
            auVar279._24_4_ = 0xff800000;
            auVar279._28_4_ = 0xff800000;
            auVar280 = ZEXT3264(auVar279);
            auVar291._8_4_ = 0x7f800000;
            auVar291._0_8_ = 0x7f8000007f800000;
            auVar291._12_4_ = 0x7f800000;
            auVar291._16_4_ = 0x7f800000;
            auVar291._20_4_ = 0x7f800000;
            auVar291._24_4_ = 0x7f800000;
            auVar291._28_4_ = 0x7f800000;
            auVar9 = vblendvps_avx(auVar291,auVar279,auVar11);
            auVar111 = vpackssdw_avx(auVar222._0_16_,auVar222._16_16_);
            auVar12 = vpmovsxwd_avx2(auVar111);
            auVar238 = vblendvps_avx(auVar238,auVar9,auVar12);
            auVar9 = vblendvps_avx(auVar279,auVar291,auVar11);
            auVar271 = ZEXT3264(auVar9);
            auVar8 = vblendvps_avx(auVar8,auVar9,auVar12);
            auVar254 = ZEXT3264(auVar8);
            auVar223._0_8_ = auVar222._0_8_ ^ 0xffffffffffffffff;
            auVar223._8_4_ = auVar222._8_4_ ^ 0xffffffff;
            auVar223._12_4_ = auVar222._12_4_ ^ 0xffffffff;
            auVar223._16_4_ = auVar222._16_4_ ^ 0xffffffff;
            auVar223._20_4_ = auVar222._20_4_ ^ 0xffffffff;
            auVar223._24_4_ = auVar222._24_4_ ^ 0xffffffff;
            auVar223._28_4_ = auVar222._28_4_ ^ 0xffffffff;
            auVar222 = vorps_avx(auVar11,auVar223);
            auVar222 = vandps_avx(auVar10,auVar222);
          }
        }
        auVar292 = ZEXT3264(_local_8c0);
        uVar98 = *(undefined4 *)&(ray->dir).field_0;
        auVar265._4_4_ = uVar98;
        auVar265._0_4_ = uVar98;
        auVar265._8_4_ = uVar98;
        auVar265._12_4_ = uVar98;
        auVar265._16_4_ = uVar98;
        auVar265._20_4_ = uVar98;
        auVar265._24_4_ = uVar98;
        auVar265._28_4_ = uVar98;
        uVar98 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        auVar302._4_4_ = uVar98;
        auVar302._0_4_ = uVar98;
        auVar302._8_4_ = uVar98;
        auVar302._12_4_ = uVar98;
        auVar302._16_4_ = uVar98;
        auVar302._20_4_ = uVar98;
        auVar302._24_4_ = uVar98;
        auVar302._28_4_ = uVar98;
        fVar197 = (ray->dir).field_0.m128[2];
        local_480 = _local_8c0;
        local_460 = vminps_avx(local_a00,auVar238);
        _local_5a0 = vmaxps_avx(_local_8c0,auVar254._0_32_);
        auVar239 = ZEXT3264(_local_5a0);
        _local_4c0 = _local_5a0;
        local_4a0 = local_a00;
        auVar8 = vcmpps_avx(_local_8c0,local_460,2);
        local_560 = vandps_avx(auVar8,auVar125);
        auVar8 = vcmpps_avx(_local_5a0,local_a00,2);
        local_5e0 = vandps_avx(auVar8,auVar125);
        auVar125 = vorps_avx(local_5e0,local_560);
        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar125 >> 0x7f,0) != '\0') ||
              (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar125 >> 0xbf,0) != '\0') ||
            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar125[0x1f] < '\0') {
          local_240 = local_5e0;
          local_260._0_8_ = auVar222._0_8_ ^ 0xffffffffffffffff;
          local_260._8_4_ = auVar222._8_4_ ^ 0xffffffff;
          local_260._12_4_ = auVar222._12_4_ ^ 0xffffffff;
          local_260._16_4_ = auVar222._16_4_ ^ 0xffffffff;
          local_260._20_4_ = auVar222._20_4_ ^ 0xffffffff;
          local_260._24_4_ = auVar222._24_4_ ^ 0xffffffff;
          local_260._28_4_ = auVar222._28_4_ ^ 0xffffffff;
          auVar254._0_4_ = fVar197 * auVar174._0_4_;
          auVar254._4_4_ = fVar197 * auVar174._4_4_;
          auVar254._8_4_ = fVar197 * auVar174._8_4_;
          auVar254._12_4_ = fVar197 * auVar174._12_4_;
          auVar254._16_4_ = fVar197 * auVar174._16_4_;
          auVar254._20_4_ = fVar197 * auVar174._20_4_;
          auVar254._28_36_ = auVar174._28_36_;
          auVar254._24_4_ = fVar197 * auVar174._24_4_;
          auVar111 = vfmadd213ps_fma(auVar144,auVar302,auVar254._0_32_);
          auVar111 = vfmadd213ps_fma(auVar123,auVar265,ZEXT1632(auVar111));
          auVar69._4_4_ = uStack_75c;
          auVar69._0_4_ = local_760;
          auVar69._8_4_ = uStack_758;
          auVar69._12_4_ = uStack_754;
          auVar69._16_4_ = uStack_750;
          auVar69._20_4_ = uStack_74c;
          auVar69._24_4_ = uStack_748;
          auVar69._28_4_ = uStack_744;
          auVar125 = vandps_avx(ZEXT1632(auVar111),auVar69);
          auVar147._8_4_ = 0x3e99999a;
          auVar147._0_8_ = 0x3e99999a3e99999a;
          auVar147._12_4_ = 0x3e99999a;
          auVar147._16_4_ = 0x3e99999a;
          auVar147._20_4_ = 0x3e99999a;
          auVar147._24_4_ = 0x3e99999a;
          auVar147._28_4_ = 0x3e99999a;
          auVar125 = vcmpps_avx(auVar125,auVar147,1);
          auVar125 = vorps_avx(auVar125,local_260);
          auVar148._8_4_ = 3;
          auVar148._0_8_ = 0x300000003;
          auVar148._12_4_ = 3;
          auVar148._16_4_ = 3;
          auVar148._20_4_ = 3;
          auVar148._24_4_ = 3;
          auVar148._28_4_ = 3;
          auVar171._8_4_ = 2;
          auVar171._0_8_ = 0x200000002;
          auVar171._12_4_ = 2;
          auVar171._16_4_ = 2;
          auVar171._20_4_ = 2;
          auVar171._24_4_ = 2;
          auVar171._28_4_ = 2;
          auVar125 = vblendvps_avx(auVar171,auVar148,auVar125);
          uVar98 = (undefined4)local_640;
          local_280._4_4_ = uVar98;
          local_280._0_4_ = uVar98;
          local_280._8_4_ = uVar98;
          local_280._12_4_ = uVar98;
          local_280._16_4_ = uVar98;
          local_280._20_4_ = uVar98;
          local_280._24_4_ = uVar98;
          local_280._28_4_ = uVar98;
          local_580 = vpcmpgtd_avx2(auVar125,local_280);
          local_5c0 = vpandn_avx2(local_580,local_560);
          auVar174 = ZEXT3264(local_5c0);
          auVar125 = local_560 & ~local_580;
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar125 >> 0x7f,0) == '\0') &&
                (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0xbf,0) == '\0') &&
              (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar125[0x1f]) {
            auVar254 = ZEXT3264(auVar302);
            fVar240 = fVar197;
            fVar241 = fVar197;
            fVar242 = fVar197;
            fVar243 = fVar197;
            fVar244 = fVar197;
            fVar211 = fVar197;
            local_800._16_16_ = (undefined1  [16])0x0;
          }
          else {
            auVar270 = vminps_avx(local_9a0,local_9c0);
            auVar111 = vmaxps_avx(local_9a0,local_9c0);
            auVar262 = vminps_avx(local_9b0,_local_9d0);
            auVar7 = vminps_avx(auVar270,auVar262);
            auVar270 = vmaxps_avx(local_9b0,_local_9d0);
            auVar262 = vmaxps_avx(auVar111,auVar270);
            auVar111 = vandps_avx(auVar7,local_9e0);
            auVar270 = vandps_avx(auVar262,local_9e0);
            auVar111 = vmaxps_avx(auVar111,auVar270);
            auVar270 = vmovshdup_avx(auVar111);
            auVar270 = vmaxss_avx(auVar270,auVar111);
            auVar111 = vshufpd_avx(auVar111,auVar111,1);
            auVar111 = vmaxss_avx(auVar111,auVar270);
            local_7e0 = (undefined1  [4])(auVar111._0_4_ * 1.9073486e-06);
            local_740._0_16_ = vshufps_avx(auVar262,auVar262,0xff);
            local_740._16_16_ = auVar219._16_16_;
            local_780._4_4_ = (float)local_8c0._4_4_ + (float)local_a20._4_4_;
            local_780._0_4_ = (float)local_8c0._0_4_ + (float)local_a20._0_4_;
            fStack_778 = fStack_8b8 + fStack_a18;
            fStack_774 = fStack_8b4 + fStack_a14;
            fStack_770 = fStack_8b0 + fStack_a10;
            fStack_76c = fStack_8ac + fStack_a0c;
            fStack_768 = fStack_8a8 + fStack_a08;
            fStack_764 = fStack_8a4 + fStack_a04;
            local_860._4_4_ = fVar197;
            local_860._0_4_ = fVar197;
            fStack_858 = fVar197;
            fStack_854 = fVar197;
            fStack_850 = fVar197;
            fStack_84c = fVar197;
            fStack_848 = fVar197;
            fStack_844 = fVar197;
            local_960 = auVar265;
            local_8e0 = auVar302;
            do {
              auVar149._8_4_ = 0x7f800000;
              auVar149._0_8_ = 0x7f8000007f800000;
              auVar149._12_4_ = 0x7f800000;
              auVar149._16_4_ = 0x7f800000;
              auVar149._20_4_ = 0x7f800000;
              auVar149._24_4_ = 0x7f800000;
              auVar149._28_4_ = 0x7f800000;
              auVar125 = auVar174._0_32_;
              auVar222 = vblendvps_avx(auVar149,_local_8c0,auVar125);
              auVar219 = vshufps_avx(auVar222,auVar222,0xb1);
              auVar219 = vminps_avx(auVar222,auVar219);
              auVar8 = vshufpd_avx(auVar219,auVar219,5);
              auVar219 = vminps_avx(auVar219,auVar8);
              auVar8 = vpermpd_avx2(auVar219,0x4e);
              auVar219 = vminps_avx(auVar219,auVar8);
              auVar222 = vcmpps_avx(auVar222,auVar219,0);
              auVar219 = auVar125 & auVar222;
              if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar219 >> 0x7f,0) != '\0') ||
                    (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar219 >> 0xbf,0) != '\0') ||
                  (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar219[0x1f] < '\0') {
                auVar125 = vandps_avx(auVar222,auVar125);
              }
              uVar92 = vmovmskps_avx(auVar125);
              iVar17 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar92 = iVar17 << 2;
              *(undefined4 *)(local_5c0 + uVar92) = 0;
              aVar1 = (ray->dir).field_0;
              local_880._0_16_ = (undefined1  [16])aVar1;
              auVar111 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              auVar174 = ZEXT464(*(uint *)(local_500 + uVar92));
              if (auVar111._0_4_ < 0.0) {
                local_b00._0_16_ = ZEXT416(*(uint *)(local_500 + uVar92));
                local_ae0._0_16_ = ZEXT416((uint)*(float *)(local_480 + uVar92));
                fVar197 = sqrtf(auVar111._0_4_);
                auVar174 = ZEXT1664(local_b00._0_16_);
                fVar233 = (float)local_ae0._0_4_;
                uVar98 = local_ae0._4_4_;
                uVar230 = local_ae0._8_4_;
                uVar232 = local_ae0._12_4_;
              }
              else {
                auVar111 = vsqrtss_avx(auVar111,auVar111);
                fVar197 = auVar111._0_4_;
                fVar233 = *(float *)(local_480 + uVar92);
                uVar98 = 0;
                uVar230 = 0;
                uVar232 = 0;
              }
              local_6e0._0_4_ = fVar197 * 1.9073486e-06;
              lVar96 = 5;
              do {
                auVar125 = local_ae0;
                local_ae0._4_4_ = uVar98;
                local_ae0._0_4_ = fVar233;
                local_ae0._8_4_ = uVar230;
                local_ae0._16_16_ = auVar125._16_16_;
                local_ae0._12_4_ = uVar232;
                auVar106._4_4_ = fVar233;
                auVar106._0_4_ = fVar233;
                auVar106._8_4_ = fVar233;
                auVar106._12_4_ = fVar233;
                auVar270 = vfmadd213ps_fma(auVar106,local_880._0_16_,_DAT_01feba10);
                fVar241 = auVar174._0_4_;
                fVar242 = 1.0 - fVar241;
                local_820._0_16_ = ZEXT416((uint)fVar242);
                fVar197 = fVar241 * fVar241;
                auVar104 = SUB6416(ZEXT464(0x40400000),0);
                auVar235 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar136 = auVar174._0_16_;
                auVar262 = vfmadd213ss_fma(auVar104,auVar136,auVar235);
                auVar111 = vfmadd213ss_fma(auVar262,ZEXT416((uint)fVar197),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar7 = vfmadd213ss_fma(auVar104,ZEXT416((uint)fVar242),auVar235);
                auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)(fVar242 * fVar242)),
                                         SUB6416(ZEXT464(0x40000000),0));
                fVar233 = fVar242 * fVar242 * -fVar241 * 0.5;
                fVar99 = auVar111._0_4_ * 0.5;
                fVar240 = auVar7._0_4_ * 0.5;
                fVar241 = fVar241 * fVar241 * -fVar242 * 0.5;
                auVar176._0_4_ = fVar241 * (float)local_9d0._0_4_;
                auVar176._4_4_ = fVar241 * (float)local_9d0._4_4_;
                auVar176._8_4_ = fVar241 * fStack_9c8;
                auVar176._12_4_ = fVar241 * fStack_9c4;
                auVar200._4_4_ = fVar240;
                auVar200._0_4_ = fVar240;
                auVar200._8_4_ = fVar240;
                auVar200._12_4_ = fVar240;
                auVar111 = vfmadd132ps_fma(auVar200,auVar176,local_9b0);
                auVar157._4_4_ = fVar99;
                auVar157._0_4_ = fVar99;
                auVar157._8_4_ = fVar99;
                auVar157._12_4_ = fVar99;
                auVar111 = vfmadd132ps_fma(auVar157,auVar111,local_9c0);
                auVar177._4_4_ = fVar233;
                auVar177._0_4_ = fVar233;
                auVar177._8_4_ = fVar233;
                auVar177._12_4_ = fVar233;
                auVar111 = vfmadd132ps_fma(auVar177,auVar111,local_9a0);
                local_a80._0_16_ = vfmadd231ss_fma(auVar235,auVar136,ZEXT416(0x41100000));
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar136,ZEXT416(0x40800000)
                                        );
                local_840._0_16_ = auVar111;
                auVar111 = vsubps_avx(auVar270,auVar111);
                _local_940 = auVar111;
                auVar111 = vdpps_avx(auVar111,auVar111,0x7f);
                auVar270 = vfmadd213ss_fma(auVar104,auVar136,ZEXT416(0xbf800000));
                local_a00._0_16_ = auVar270;
                local_b00._0_16_ = auVar136;
                local_ac0._0_16_ = auVar111;
                if (auVar111._0_4_ < 0.0) {
                  local_a40._0_4_ = auVar262._0_4_;
                  local_a60._0_4_ = fVar197;
                  local_8a0._0_16_ = auVar7;
                  local_800._0_4_ = fVar242 * -2.0;
                  local_820._0_16_ = ZEXT416((uint)fVar242);
                  auVar280._0_4_ = sqrtf(auVar111._0_4_);
                  auVar280._4_60_ = extraout_var;
                  auVar262 = ZEXT416((uint)local_a40._0_4_);
                  auVar111 = auVar280._0_16_;
                  fVar233 = (float)local_800._0_4_;
                  fVar197 = (float)local_a60._0_4_;
                  auVar7 = local_8a0._0_16_;
                  auVar136 = local_b00._0_16_;
                }
                else {
                  auVar111 = vsqrtss_avx(auVar111,auVar111);
                  fVar233 = fVar242 * -2.0;
                }
                auVar292 = ZEXT1664(local_a80._0_16_);
                auVar280 = ZEXT464((uint)fVar197);
                fVar99 = local_820._0_4_;
                fVar240 = auVar136._0_4_;
                auVar270 = vfmadd213ss_fma(auVar262,ZEXT416((uint)(fVar240 + fVar240)),
                                           ZEXT416((uint)(fVar240 * fVar240 * 3.0)));
                auVar103 = SUB6416(ZEXT464(0x40000000),0);
                auVar262 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar136,auVar103);
                auVar235 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * fVar99 * -3.0)),
                                           ZEXT416((uint)(fVar99 + fVar99)),auVar262);
                auVar104 = vfnmadd231ss_fma(ZEXT416((uint)(fVar240 * (fVar99 + fVar99))),
                                            local_820._0_16_,local_820._0_16_);
                auVar262 = vfmadd213ss_fma(ZEXT416((uint)fVar233),auVar136,ZEXT416((uint)fVar197));
                fVar233 = auVar104._0_4_ * 0.5;
                fVar99 = auVar270._0_4_ * 0.5;
                fVar240 = auVar235._0_4_ * 0.5;
                fVar241 = auVar262._0_4_ * 0.5;
                auVar178._0_4_ = (float)local_9d0._0_4_ * fVar241;
                auVar178._4_4_ = (float)local_9d0._4_4_ * fVar241;
                auVar178._8_4_ = fStack_9c8 * fVar241;
                auVar178._12_4_ = fStack_9c4 * fVar241;
                auVar158._4_4_ = fVar240;
                auVar158._0_4_ = fVar240;
                auVar158._8_4_ = fVar240;
                auVar158._12_4_ = fVar240;
                auVar270 = vfmadd213ps_fma(auVar158,local_9b0,auVar178);
                auVar133._4_4_ = fVar99;
                auVar133._0_4_ = fVar99;
                auVar133._8_4_ = fVar99;
                auVar133._12_4_ = fVar99;
                auVar270 = vfmadd213ps_fma(auVar133,local_9c0,auVar270);
                auVar263._4_4_ = fVar233;
                auVar263._0_4_ = fVar233;
                auVar263._8_4_ = fVar233;
                auVar263._12_4_ = fVar233;
                local_820._0_16_ = vfmadd213ps_fma(auVar263,local_9a0,auVar270);
                auVar136 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar136,auVar103);
                auVar107._0_4_ = (float)local_9d0._0_4_ * (float)local_a00._0_4_;
                auVar107._4_4_ = (float)local_9d0._4_4_ * (float)local_a00._0_4_;
                auVar107._8_4_ = fStack_9c8 * (float)local_a00._0_4_;
                auVar107._12_4_ = fStack_9c4 * (float)local_a00._0_4_;
                uVar98 = auVar7._0_4_;
                auVar159._4_4_ = uVar98;
                auVar159._0_4_ = uVar98;
                auVar159._8_4_ = uVar98;
                auVar159._12_4_ = uVar98;
                auVar270 = vfmadd213ps_fma(auVar159,local_9b0,auVar107);
                uVar98 = local_a80._0_4_;
                auVar179._4_4_ = uVar98;
                auVar179._0_4_ = uVar98;
                auVar179._8_4_ = uVar98;
                auVar179._12_4_ = uVar98;
                auVar270 = vfmadd213ps_fma(auVar179,local_9c0,auVar270);
                auVar262 = vdpps_avx(local_820._0_16_,local_820._0_16_,0x7f);
                auVar134._0_4_ = auVar136._0_4_;
                auVar134._4_4_ = auVar134._0_4_;
                auVar134._8_4_ = auVar134._0_4_;
                auVar134._12_4_ = auVar134._0_4_;
                auVar136 = vfmadd213ps_fma(auVar134,local_9a0,auVar270);
                auVar270 = vblendps_avx(auVar262,_DAT_01feba10,0xe);
                auVar7 = vrsqrtss_avx(auVar270,auVar270);
                fVar240 = auVar262._0_4_;
                fVar233 = auVar7._0_4_;
                auVar7 = vdpps_avx(local_820._0_16_,auVar136,0x7f);
                fVar233 = fVar233 * 1.5 + fVar240 * -0.5 * fVar233 * fVar233 * fVar233;
                auVar135._0_4_ = auVar136._0_4_ * fVar240;
                auVar135._4_4_ = auVar136._4_4_ * fVar240;
                auVar135._8_4_ = auVar136._8_4_ * fVar240;
                auVar135._12_4_ = auVar136._12_4_ * fVar240;
                fVar99 = auVar7._0_4_;
                auVar217._0_4_ = local_820._0_4_ * fVar99;
                auVar217._4_4_ = local_820._4_4_ * fVar99;
                fVar241 = local_820._8_4_;
                auVar217._8_4_ = fVar241 * fVar99;
                fVar242 = local_820._12_4_;
                auVar217._12_4_ = fVar242 * fVar99;
                auVar7 = vsubps_avx(auVar135,auVar217);
                auVar270 = vrcpss_avx(auVar270,auVar270);
                auVar136 = vfnmadd213ss_fma(auVar270,auVar262,auVar103);
                fVar99 = auVar270._0_4_ * auVar136._0_4_;
                auVar270 = vmaxss_avx(ZEXT416((uint)local_7e0),
                                      ZEXT416((uint)((float)local_6e0._0_4_ * (float)local_ae0._0_4_
                                                    )));
                local_a00._0_4_ = auVar270._0_4_;
                auVar259._0_8_ = local_820._0_8_ ^ 0x8000000080000000;
                auVar259._8_4_ = -fVar241;
                auVar259._12_4_ = -fVar242;
                auVar180._0_4_ = fVar233 * auVar7._0_4_ * fVar99;
                auVar180._4_4_ = fVar233 * auVar7._4_4_ * fVar99;
                auVar180._8_4_ = fVar233 * auVar7._8_4_ * fVar99;
                auVar180._12_4_ = fVar233 * auVar7._12_4_ * fVar99;
                auVar248._0_4_ = local_820._0_4_ * fVar233;
                auVar248._4_4_ = local_820._4_4_ * fVar233;
                auVar248._8_4_ = fVar241 * fVar233;
                auVar248._12_4_ = fVar242 * fVar233;
                if (fVar240 < -fVar240) {
                  local_a40._0_4_ = auVar111._0_4_;
                  local_a60._0_16_ = auVar259;
                  local_8a0._0_16_ = auVar180;
                  auVar280 = ZEXT1664(ZEXT416((uint)fVar197));
                  auVar292 = ZEXT1664(local_a80._0_16_);
                  local_a80._0_16_ = auVar248;
                  fVar197 = sqrtf(fVar240);
                  auVar111 = ZEXT416((uint)local_a40._0_4_);
                  auVar180 = local_8a0._0_16_;
                  auVar259 = local_a60._0_16_;
                }
                else {
                  auVar270 = vsqrtss_avx(auVar262,auVar262);
                  fVar197 = auVar270._0_4_;
                  local_a80._0_16_ = auVar248;
                }
                local_a40._0_16_ = vdpps_avx(_local_940,local_a80._0_16_,0x7f);
                auVar136 = vfmadd213ss_fma(ZEXT416((uint)local_7e0),auVar111,
                                           ZEXT416((uint)local_a00._0_4_));
                auVar270 = vdpps_avx(auVar259,local_a80._0_16_,0x7f);
                auVar262 = vdpps_avx(_local_940,auVar180,0x7f);
                auVar7 = vdpps_avx(local_880._0_16_,local_a80._0_16_,0x7f);
                auVar111 = vfmadd213ss_fma(ZEXT416((uint)(auVar111._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_7e0 / fVar197)),auVar136);
                local_a60._0_4_ = auVar111._0_4_;
                auVar108._0_4_ = local_a40._0_4_ * local_a40._0_4_;
                auVar108._4_4_ = local_a40._4_4_ * local_a40._4_4_;
                auVar108._8_4_ = local_a40._8_4_ * local_a40._8_4_;
                auVar108._12_4_ = local_a40._12_4_ * local_a40._12_4_;
                auVar111 = vdpps_avx(_local_940,auVar259,0x7f);
                auVar235 = vsubps_avx(local_ac0._0_16_,auVar108);
                auVar136 = vrsqrtss_avx(auVar235,auVar235);
                fVar233 = auVar235._0_4_;
                fVar197 = auVar136._0_4_;
                fVar197 = fVar197 * 1.5 + fVar233 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar136 = vdpps_avx(_local_940,local_880._0_16_,0x7f);
                local_a80._0_16_ = ZEXT416((uint)(auVar270._0_4_ + auVar262._0_4_));
                auVar111 = vfnmadd231ss_fma(auVar111,local_a40._0_16_,local_a80._0_16_);
                auVar270 = vfnmadd231ss_fma(auVar136,local_a40._0_16_,auVar7);
                if (fVar233 < 0.0) {
                  local_8a0._0_16_ = auVar7;
                  local_800._0_16_ = auVar111;
                  local_700._0_4_ = fVar197;
                  _local_720 = auVar270;
                  auVar280 = ZEXT1664(auVar280._0_16_);
                  auVar292 = ZEXT1664(auVar292._0_16_);
                  fVar233 = sqrtf(fVar233);
                  fVar197 = (float)local_700._0_4_;
                  auVar270 = _local_720;
                  auVar262 = local_ac0._0_16_;
                  auVar111 = local_800._0_16_;
                  auVar7 = local_8a0._0_16_;
                }
                else {
                  auVar262 = vsqrtss_avx(auVar235,auVar235);
                  fVar233 = auVar262._0_4_;
                  auVar262 = local_ac0._0_16_;
                }
                auVar239 = ZEXT1664(auVar262);
                auVar254 = ZEXT3264(local_8e0);
                auVar136 = vpermilps_avx(local_840._0_16_,0xff);
                auVar235 = vpermilps_avx(local_820._0_16_,0xff);
                auVar111 = vfmsub213ss_fma(auVar111,ZEXT416((uint)fVar197),auVar235);
                auVar181._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
                auVar181._8_4_ = auVar7._8_4_ ^ 0x80000000;
                auVar181._12_4_ = auVar7._12_4_ ^ 0x80000000;
                auVar201._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
                auVar201._8_4_ = auVar111._8_4_ ^ 0x80000000;
                auVar201._12_4_ = auVar111._12_4_ ^ 0x80000000;
                auVar271 = ZEXT1664(local_a80._0_16_);
                auVar104 = ZEXT416((uint)(auVar270._0_4_ * fVar197));
                auVar270 = vfmsub231ss_fma(ZEXT416((uint)(auVar7._0_4_ * auVar111._0_4_)),
                                           local_a80._0_16_,auVar104);
                auVar111 = vinsertps_avx(auVar104,auVar181,0x10);
                uVar98 = auVar270._0_4_;
                auVar182._4_4_ = uVar98;
                auVar182._0_4_ = uVar98;
                auVar182._8_4_ = uVar98;
                auVar182._12_4_ = uVar98;
                auVar111 = vdivps_avx(auVar111,auVar182);
                auVar136 = ZEXT416((uint)(fVar233 - auVar136._0_4_));
                auVar7 = vinsertps_avx(local_a40._0_16_,auVar136,0x10);
                auVar160._0_4_ = auVar7._0_4_ * auVar111._0_4_;
                auVar160._4_4_ = auVar7._4_4_ * auVar111._4_4_;
                auVar160._8_4_ = auVar7._8_4_ * auVar111._8_4_;
                auVar160._12_4_ = auVar7._12_4_ * auVar111._12_4_;
                auVar111 = vinsertps_avx(auVar201,local_a80._0_16_,0x1c);
                auVar111 = vdivps_avx(auVar111,auVar182);
                auVar270 = vhaddps_avx(auVar160,auVar160);
                auVar183._0_4_ = auVar7._0_4_ * auVar111._0_4_;
                auVar183._4_4_ = auVar7._4_4_ * auVar111._4_4_;
                auVar183._8_4_ = auVar7._8_4_ * auVar111._8_4_;
                auVar183._12_4_ = auVar7._12_4_ * auVar111._12_4_;
                auVar111 = vhaddps_avx(auVar183,auVar183);
                fVar99 = (float)local_b00._0_4_ - auVar270._0_4_;
                auVar174 = ZEXT464((uint)fVar99);
                fVar233 = (float)local_ae0._0_4_ - auVar111._0_4_;
                uVar98 = 0;
                uVar230 = 0;
                uVar232 = 0;
                auVar111 = vandps_avx(local_a40._0_16_,local_9e0);
                bVar56 = true;
                fVar210 = (float)local_a20._0_4_;
                fVar266 = (float)local_a20._4_4_;
                fVar267 = fStack_a18;
                fVar268 = fStack_a14;
                fVar293 = fStack_a10;
                fVar294 = fStack_a0c;
                fVar295 = fStack_a08;
                fVar296 = fStack_a04;
                fVar197 = (float)local_860._0_4_;
                fVar240 = (float)local_860._4_4_;
                fVar241 = fStack_858;
                fVar242 = fStack_854;
                fVar243 = fStack_850;
                fVar244 = fStack_84c;
                fVar211 = fStack_848;
                if (auVar111._0_4_ < (float)local_a60._0_4_) {
                  auVar270 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a60._0_4_ +
                                                           (float)local_a00._0_4_)),local_740._0_16_
                                             ,ZEXT416(0x36000000));
                  auVar111 = vandps_avx(auVar136,local_9e0);
                  if (auVar111._0_4_ < auVar270._0_4_) {
                    fVar233 = fVar233 + (float)local_7b0._0_4_;
                    uVar98 = 0;
                    uVar230 = 0;
                    uVar232 = 0;
                    if (((((ray->org).field_0.m128[3] <= fVar233) && (fVar233 <= ray->tfar)) &&
                        (0.0 <= fVar99)) && (fVar99 <= 1.0)) {
                      local_ac0._0_4_ = ray->tfar;
                      auVar111 = vrsqrtss_avx(auVar262,auVar262);
                      fVar224 = auVar111._0_4_;
                      pGVar4 = (context->scene->geometries).items[local_a88].ptr;
                      if ((pGVar4->mask & ray->mask) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_R14B = 1;
                        }
                        else {
                          fVar197 = fVar224 * 1.5 +
                                    auVar262._0_4_ * -0.5 * fVar224 * fVar224 * fVar224;
                          auVar137._0_4_ = fVar197 * (float)local_940._0_4_;
                          auVar137._4_4_ = fVar197 * (float)local_940._4_4_;
                          auVar137._8_4_ = fVar197 * fStack_938;
                          auVar137._12_4_ = fVar197 * fStack_934;
                          auVar239 = ZEXT1664(local_820._0_16_);
                          auVar7 = vfmadd213ps_fma(auVar235,auVar137,local_820._0_16_);
                          auVar111 = vshufps_avx(auVar137,auVar137,0xc9);
                          auVar270 = vshufps_avx(local_820._0_16_,local_820._0_16_,0xc9);
                          auVar138._0_4_ = auVar137._0_4_ * auVar270._0_4_;
                          auVar138._4_4_ = auVar137._4_4_ * auVar270._4_4_;
                          auVar138._8_4_ = auVar137._8_4_ * auVar270._8_4_;
                          auVar138._12_4_ = auVar137._12_4_ * auVar270._12_4_;
                          auVar262 = vfmsub231ps_fma(auVar138,local_820._0_16_,auVar111);
                          auVar111 = vshufps_avx(auVar262,auVar262,0xc9);
                          auVar270 = vshufps_avx(auVar7,auVar7,0xc9);
                          auVar262 = vshufps_avx(auVar262,auVar262,0xd2);
                          auVar109._0_4_ = auVar7._0_4_ * auVar262._0_4_;
                          auVar109._4_4_ = auVar7._4_4_ * auVar262._4_4_;
                          auVar109._8_4_ = auVar7._8_4_ * auVar262._8_4_;
                          auVar109._12_4_ = auVar7._12_4_ * auVar262._12_4_;
                          auVar270 = vfmsub231ps_fma(auVar109,auVar111,auVar270);
                          auVar111 = vshufps_avx(auVar270,auVar270,0xe9);
                          local_920 = vmovlps_avx(auVar111);
                          local_918 = auVar270._0_4_;
                          local_910 = 0;
                          local_90c = (undefined4)local_8e8;
                          local_908 = (undefined4)local_a88;
                          local_904 = context->user->instID[0];
                          local_900 = context->user->instPrimID[0];
                          ray->tfar = fVar233;
                          local_b04 = -1;
                          local_990.valid = &local_b04;
                          local_990.geometryUserPtr = pGVar4->userPtr;
                          local_990.context = context->user;
                          local_990.hit = (RTCHitN *)&local_920;
                          local_990.N = 1;
                          local_b00._0_16_ = ZEXT416((uint)fVar99);
                          local_ae0._0_16_ = ZEXT416((uint)fVar233);
                          local_990.ray = (RTCRayN *)ray;
                          local_914 = fVar99;
                          if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016b6600:
                            p_Var5 = context->args->filter;
                            fVar99 = (float)local_ac0._0_4_;
                            fVar210 = (float)local_a20._0_4_;
                            fVar266 = (float)local_a20._4_4_;
                            fVar267 = fStack_a18;
                            fVar268 = fStack_a14;
                            fVar293 = fStack_a10;
                            fVar294 = fStack_a0c;
                            fVar295 = fStack_a08;
                            fVar296 = fStack_a04;
                            fVar197 = (float)local_860._0_4_;
                            fVar240 = (float)local_860._4_4_;
                            fVar241 = fStack_858;
                            fVar242 = fStack_854;
                            fVar243 = fStack_850;
                            fVar244 = fStack_84c;
                            fVar211 = fStack_848;
                            if (p_Var5 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                                auVar239 = ZEXT1664(auVar239._0_16_);
                                auVar271 = ZEXT1664(auVar271._0_16_);
                                auVar280 = ZEXT1664(auVar280._0_16_);
                                auVar292 = ZEXT1664(auVar292._0_16_);
                                (*p_Var5)(&local_990);
                                auVar174 = ZEXT1664(local_b00._0_16_);
                                auVar254 = ZEXT3264(local_8e0);
                                fVar210 = (float)local_a20._0_4_;
                                fVar266 = (float)local_a20._4_4_;
                                fVar267 = fStack_a18;
                                fVar268 = fStack_a14;
                                fVar293 = fStack_a10;
                                fVar294 = fStack_a0c;
                                fVar295 = fStack_a08;
                                fVar296 = fStack_a04;
                                fVar233 = (float)local_ae0._0_4_;
                                uVar98 = local_ae0._4_4_;
                                uVar230 = local_ae0._8_4_;
                                uVar232 = local_ae0._12_4_;
                                fVar197 = (float)local_860._0_4_;
                                fVar240 = (float)local_860._4_4_;
                                fVar241 = fStack_858;
                                fVar242 = fStack_854;
                                fVar243 = fStack_850;
                                fVar244 = fStack_84c;
                                fVar211 = fStack_848;
                              }
                              fVar99 = (float)local_ac0._0_4_;
                              if (*local_990.valid == 0) {
                                unaff_R14B = 0;
                                goto LAB_016b6690;
                              }
                            }
                            unaff_R14B = 1;
                          }
                          else {
                            auVar239 = ZEXT1664(local_820._0_16_);
                            auVar271 = ZEXT1664(local_a80._0_16_);
                            auVar280 = ZEXT1664(auVar280._0_16_);
                            auVar292 = ZEXT1664(auVar292._0_16_);
                            (*pGVar4->occlusionFilterN)(&local_990);
                            auVar174 = ZEXT1664(local_b00._0_16_);
                            auVar254 = ZEXT3264(local_8e0);
                            fVar233 = (float)local_ae0._0_4_;
                            uVar98 = local_ae0._4_4_;
                            uVar230 = local_ae0._8_4_;
                            uVar232 = local_ae0._12_4_;
                            if (*local_990.valid != 0) goto LAB_016b6600;
                            unaff_R14B = 0;
                            fVar99 = (float)local_ac0._0_4_;
                            fVar210 = (float)local_a20._0_4_;
                            fVar266 = (float)local_a20._4_4_;
                            fVar267 = fStack_a18;
                            fVar268 = fStack_a14;
                            fVar293 = fStack_a10;
                            fVar294 = fStack_a0c;
                            fVar295 = fStack_a08;
                            fVar296 = fStack_a04;
                            fVar197 = (float)local_860._0_4_;
                            fVar240 = (float)local_860._4_4_;
                            fVar241 = fStack_858;
                            fVar242 = fStack_854;
                            fVar243 = fStack_850;
                            fVar244 = fStack_84c;
                            fVar211 = fStack_848;
                          }
LAB_016b6690:
                          if (unaff_R14B == 0) {
                            ray->tfar = fVar99;
                          }
                        }
                        bVar56 = false;
                        goto LAB_016b646c;
                      }
                    }
                    bVar56 = false;
                    unaff_R14B = 0;
                  }
                }
LAB_016b646c:
                if (!bVar56) goto LAB_016b66b0;
                lVar96 = lVar96 + -1;
              } while (lVar96 != 0);
              unaff_R14B = 0;
LAB_016b66b0:
              unaff_R14B = unaff_R14B & 1;
              bVar95 = bVar95 | unaff_R14B;
              fVar233 = ray->tfar;
              auVar126._4_4_ = fVar233;
              auVar126._0_4_ = fVar233;
              auVar126._8_4_ = fVar233;
              auVar126._12_4_ = fVar233;
              auVar126._16_4_ = fVar233;
              auVar126._20_4_ = fVar233;
              auVar126._24_4_ = fVar233;
              auVar126._28_4_ = fVar233;
              auVar222 = vcmpps_avx(_local_780,auVar126,2);
              auVar125 = vandps_avx(auVar222,local_5c0);
              auVar174 = ZEXT3264(auVar125);
              auVar222 = local_5c0 & auVar222;
              auVar265 = local_960;
              local_5c0 = auVar125;
            } while ((((((((auVar222 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar222 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar222 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar222 >> 0x7f,0) != '\0') ||
                       (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar222 >> 0xbf,0) != '\0') ||
                     (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar222[0x1f] < '\0');
          }
          auVar129._0_4_ = fVar197 * (float)local_6a0._0_4_;
          auVar129._4_4_ = fVar240 * (float)local_6a0._4_4_;
          auVar129._8_4_ = fVar241 * fStack_698;
          auVar129._12_4_ = fVar242 * fStack_694;
          auVar129._16_4_ = fVar243 * fStack_690;
          auVar129._20_4_ = fVar244 * fStack_68c;
          auVar129._28_36_ = auVar174._28_36_;
          auVar129._24_4_ = fVar211 * fStack_688;
          auVar111 = vfmadd213ps_fma(local_680,auVar254._0_32_,auVar129._0_32_);
          auVar111 = vfmadd213ps_fma(local_660,auVar265,ZEXT1632(auVar111));
          auVar70._4_4_ = uStack_75c;
          auVar70._0_4_ = local_760;
          auVar70._8_4_ = uStack_758;
          auVar70._12_4_ = uStack_754;
          auVar70._16_4_ = uStack_750;
          auVar70._20_4_ = uStack_74c;
          auVar70._24_4_ = uStack_748;
          auVar70._28_4_ = uStack_744;
          auVar125 = vandps_avx(ZEXT1632(auVar111),auVar70);
          auVar150._8_4_ = 0x3e99999a;
          auVar150._0_8_ = 0x3e99999a3e99999a;
          auVar150._12_4_ = 0x3e99999a;
          auVar150._16_4_ = 0x3e99999a;
          auVar150._20_4_ = 0x3e99999a;
          auVar150._24_4_ = 0x3e99999a;
          auVar150._28_4_ = 0x3e99999a;
          auVar125 = vcmpps_avx(auVar125,auVar150,1);
          auVar222 = vorps_avx(auVar125,local_260);
          auVar151._0_4_ = fVar210 + (float)local_5a0._0_4_;
          auVar151._4_4_ = fVar266 + (float)local_5a0._4_4_;
          auVar151._8_4_ = fVar267 + fStack_598;
          auVar151._12_4_ = fVar268 + fStack_594;
          auVar151._16_4_ = fVar293 + fStack_590;
          auVar151._20_4_ = fVar294 + fStack_58c;
          auVar151._24_4_ = fVar295 + fStack_588;
          auVar151._28_4_ = fVar296 + fStack_584;
          fVar197 = ray->tfar;
          auVar172._4_4_ = fVar197;
          auVar172._0_4_ = fVar197;
          auVar172._8_4_ = fVar197;
          auVar172._12_4_ = fVar197;
          auVar172._16_4_ = fVar197;
          auVar172._20_4_ = fVar197;
          auVar172._24_4_ = fVar197;
          auVar172._28_4_ = fVar197;
          auVar125 = vcmpps_avx(auVar151,auVar172,2);
          local_740 = vandps_avx(auVar125,local_240);
          auVar152._8_4_ = 3;
          auVar152._0_8_ = 0x300000003;
          auVar152._12_4_ = 3;
          auVar152._16_4_ = 3;
          auVar152._20_4_ = 3;
          auVar152._24_4_ = 3;
          auVar152._28_4_ = 3;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar125 = vblendvps_avx(auVar173,auVar152,auVar222);
          _local_780 = vpcmpgtd_avx2(auVar125,local_280);
          auVar125 = vpandn_avx2(_local_780,local_740);
          auVar222 = local_740 & ~_local_780;
          if ((((((((auVar222 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar222 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar222 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar222 >> 0x7f,0) != '\0') ||
                (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar222 >> 0xbf,0) != '\0') ||
              (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar222[0x1f] < '\0') {
            auVar270 = vminps_avx(local_9a0,local_9c0);
            auVar111 = vmaxps_avx(local_9a0,local_9c0);
            auVar262 = vminps_avx(local_9b0,_local_9d0);
            auVar7 = vminps_avx(auVar270,auVar262);
            auVar270 = vmaxps_avx(local_9b0,_local_9d0);
            auVar262 = vmaxps_avx(auVar111,auVar270);
            auVar111 = vandps_avx(auVar7,local_9e0);
            auVar270 = vandps_avx(auVar262,local_9e0);
            auVar111 = vmaxps_avx(auVar111,auVar270);
            auVar270 = vmovshdup_avx(auVar111);
            auVar270 = vmaxss_avx(auVar270,auVar111);
            auVar111 = vshufpd_avx(auVar111,auVar111,1);
            auVar111 = vmaxss_avx(auVar111,auVar270);
            local_880._0_4_ = auVar111._0_4_ * 1.9073486e-06;
            local_800._0_16_ = vshufps_avx(auVar262,auVar262,0xff);
            local_700 = _local_4c0;
            local_720._4_4_ = (float)local_4c0._4_4_ + fVar266;
            local_720._0_4_ = (float)local_4c0._0_4_ + fVar210;
            fStack_718 = fStack_4b8 + fVar267;
            fStack_714 = fStack_4b4 + fVar268;
            fStack_710 = fStack_4b0 + fVar293;
            fStack_70c = fStack_4ac + fVar294;
            fStack_708 = fStack_4a8 + fVar295;
            fStack_704 = fStack_4a4 + fVar296;
            do {
              auVar153._8_4_ = 0x7f800000;
              auVar153._0_8_ = 0x7f8000007f800000;
              auVar153._12_4_ = 0x7f800000;
              auVar153._16_4_ = 0x7f800000;
              auVar153._20_4_ = 0x7f800000;
              auVar153._24_4_ = 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar222 = vblendvps_avx(auVar153,local_700,auVar125);
              auVar219 = vshufps_avx(auVar222,auVar222,0xb1);
              auVar219 = vminps_avx(auVar222,auVar219);
              auVar8 = vshufpd_avx(auVar219,auVar219,5);
              auVar219 = vminps_avx(auVar219,auVar8);
              auVar8 = vpermpd_avx2(auVar219,0x4e);
              auVar219 = vminps_avx(auVar219,auVar8);
              auVar219 = vcmpps_avx(auVar222,auVar219,0);
              auVar8 = auVar125 & auVar219;
              auVar222 = auVar125;
              if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar8 >> 0x7f,0) != '\0') ||
                    (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar8 >> 0xbf,0) != '\0') ||
                  (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar8[0x1f] < '\0') {
                auVar222 = vandps_avx(auVar219,auVar125);
              }
              uVar92 = vmovmskps_avx(auVar222);
              iVar17 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar92 = iVar17 << 2;
              local_5e0 = auVar125;
              *(undefined4 *)(local_5e0 + uVar92) = 0;
              aVar1 = (ray->dir).field_0;
              local_a00._0_16_ = (undefined1  [16])aVar1;
              auVar111 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              auVar174 = ZEXT464(*(uint *)(local_520 + uVar92));
              auVar271 = ZEXT464(*(uint *)(local_4a0 + uVar92));
              if (auVar111._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_520 + uVar92));
                local_b00._0_16_ = ZEXT416(*(uint *)(local_4a0 + uVar92));
                fVar197 = sqrtf(auVar111._0_4_);
                auVar271 = ZEXT1664(local_b00._0_16_);
                auVar174 = ZEXT1664(local_ae0._0_16_);
              }
              else {
                auVar111 = vsqrtss_avx(auVar111,auVar111);
                fVar197 = auVar111._0_4_;
              }
              local_6e0._0_4_ = fVar197 * 1.9073486e-06;
              lVar96 = 5;
              do {
                uVar98 = auVar271._0_4_;
                auVar110._4_4_ = uVar98;
                auVar110._0_4_ = uVar98;
                auVar110._8_4_ = uVar98;
                auVar110._12_4_ = uVar98;
                auVar270 = vfmadd213ps_fma(auVar110,local_a00._0_16_,_DAT_01feba10);
                fVar241 = auVar174._0_4_;
                fVar242 = 1.0 - fVar241;
                _local_940 = ZEXT416((uint)fVar242);
                fVar197 = fVar241 * fVar241;
                auVar104 = SUB6416(ZEXT464(0x40400000),0);
                auVar136 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar235 = auVar174._0_16_;
                auVar262 = vfmadd213ss_fma(auVar104,auVar235,auVar136);
                auVar111 = vfmadd213ss_fma(auVar262,ZEXT416((uint)fVar197),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar7 = vfmadd213ss_fma(auVar104,ZEXT416((uint)fVar242),auVar136);
                auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)(fVar242 * fVar242)),
                                         SUB6416(ZEXT464(0x40000000),0));
                fVar233 = fVar242 * fVar242 * -fVar241 * 0.5;
                fVar99 = auVar111._0_4_ * 0.5;
                fVar240 = auVar7._0_4_ * 0.5;
                fVar241 = fVar241 * fVar241 * -fVar242 * 0.5;
                auVar184._0_4_ = fVar241 * (float)local_9d0._0_4_;
                auVar184._4_4_ = fVar241 * (float)local_9d0._4_4_;
                auVar184._8_4_ = fVar241 * fStack_9c8;
                auVar184._12_4_ = fVar241 * fStack_9c4;
                auVar202._4_4_ = fVar240;
                auVar202._0_4_ = fVar240;
                auVar202._8_4_ = fVar240;
                auVar202._12_4_ = fVar240;
                auVar111 = vfmadd132ps_fma(auVar202,auVar184,local_9b0);
                auVar161._4_4_ = fVar99;
                auVar161._0_4_ = fVar99;
                auVar161._8_4_ = fVar99;
                auVar161._12_4_ = fVar99;
                auVar111 = vfmadd132ps_fma(auVar161,auVar111,local_9c0);
                auVar185._4_4_ = fVar233;
                auVar185._0_4_ = fVar233;
                auVar185._8_4_ = fVar233;
                auVar185._12_4_ = fVar233;
                auVar111 = vfmadd132ps_fma(auVar185,auVar111,local_9a0);
                auVar136 = vfmadd231ss_fma(auVar136,auVar235,ZEXT416(0x41100000));
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar235,ZEXT416(0x40800000)
                                        );
                local_840._0_16_ = auVar7;
                local_820._0_16_ = auVar111;
                auVar111 = vsubps_avx(auVar270,auVar111);
                _local_7e0 = auVar111;
                auVar111 = vdpps_avx(auVar111,auVar111,0x7f);
                auVar270 = vfmadd213ss_fma(auVar104,auVar235,ZEXT416(0xbf800000));
                local_a40._0_16_ = auVar270;
                local_ae0._0_16_ = auVar235;
                local_b00._0_16_ = auVar271._0_16_;
                local_ac0._0_16_ = auVar111;
                if (auVar111._0_4_ < 0.0) {
                  local_a60._0_4_ = auVar262._0_4_;
                  local_a80._0_4_ = fVar197;
                  local_960._0_16_ = auVar136;
                  local_8e0._0_4_ = fVar242 * -2.0;
                  _local_940 = ZEXT416((uint)fVar242);
                  auVar292._0_4_ = sqrtf(auVar111._0_4_);
                  auVar292._4_60_ = extraout_var_00;
                  auVar262 = ZEXT416((uint)local_a60._0_4_);
                  auVar111 = auVar292._0_16_;
                  fVar233 = (float)local_8e0._0_4_;
                  auVar136 = local_960._0_16_;
                  auVar235 = local_ae0._0_16_;
                  auVar270 = local_b00._0_16_;
                }
                else {
                  auVar111 = vsqrtss_avx(auVar111,auVar111);
                  fVar233 = fVar242 * -2.0;
                  local_a80._0_4_ = fVar197;
                  auVar270 = auVar271._0_16_;
                }
                fVar197 = local_940._0_4_;
                fVar99 = auVar235._0_4_;
                auVar262 = vfmadd213ss_fma(auVar262,ZEXT416((uint)(fVar99 + fVar99)),
                                           ZEXT416((uint)(fVar99 * fVar99 * 3.0)));
                auVar156 = SUB6416(ZEXT464(0x40000000),0);
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar235,auVar156);
                auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197 * -3.0)),
                                           ZEXT416((uint)(fVar197 + fVar197)),auVar7);
                auVar103 = vfnmadd231ss_fma(ZEXT416((uint)(fVar99 * (fVar197 + fVar197))),_local_940
                                            ,_local_940);
                auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar233),auVar235,
                                         ZEXT416((uint)local_a80._0_4_));
                fVar197 = auVar103._0_4_ * 0.5;
                fVar233 = auVar262._0_4_ * 0.5;
                fVar99 = auVar104._0_4_ * 0.5;
                fVar240 = auVar7._0_4_ * 0.5;
                auVar186._0_4_ = (float)local_9d0._0_4_ * fVar240;
                auVar186._4_4_ = (float)local_9d0._4_4_ * fVar240;
                auVar186._8_4_ = fStack_9c8 * fVar240;
                auVar186._12_4_ = fStack_9c4 * fVar240;
                auVar162._4_4_ = fVar99;
                auVar162._0_4_ = fVar99;
                auVar162._8_4_ = fVar99;
                auVar162._12_4_ = fVar99;
                auVar262 = vfmadd213ps_fma(auVar162,local_9b0,auVar186);
                auVar139._4_4_ = fVar233;
                auVar139._0_4_ = fVar233;
                auVar139._8_4_ = fVar233;
                auVar139._12_4_ = fVar233;
                auVar262 = vfmadd213ps_fma(auVar139,local_9c0,auVar262);
                auVar273._4_4_ = fVar197;
                auVar273._0_4_ = fVar197;
                auVar273._8_4_ = fVar197;
                auVar273._12_4_ = fVar197;
                _local_940 = vfmadd213ps_fma(auVar273,local_9a0,auVar262);
                auVar280 = ZEXT1664(_local_940);
                auVar235 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar235,auVar156);
                auVar112._0_4_ = (float)local_9d0._0_4_ * (float)local_a40._0_4_;
                auVar112._4_4_ = (float)local_9d0._4_4_ * (float)local_a40._0_4_;
                auVar112._8_4_ = fStack_9c8 * (float)local_a40._0_4_;
                auVar112._12_4_ = fStack_9c4 * (float)local_a40._0_4_;
                auVar163._4_4_ = local_840._0_4_;
                auVar163._0_4_ = local_840._0_4_;
                auVar163._8_4_ = local_840._0_4_;
                auVar163._12_4_ = local_840._0_4_;
                auVar262 = vfmadd213ps_fma(auVar163,local_9b0,auVar112);
                uVar98 = auVar136._0_4_;
                auVar187._4_4_ = uVar98;
                auVar187._0_4_ = uVar98;
                auVar187._8_4_ = uVar98;
                auVar187._12_4_ = uVar98;
                auVar262 = vfmadd213ps_fma(auVar187,local_9c0,auVar262);
                auVar7 = vdpps_avx(_local_940,_local_940,0x7f);
                auVar140._0_4_ = auVar235._0_4_;
                auVar140._4_4_ = auVar140._0_4_;
                auVar140._8_4_ = auVar140._0_4_;
                auVar140._12_4_ = auVar140._0_4_;
                auVar235 = vfmadd213ps_fma(auVar140,local_9a0,auVar262);
                auVar262 = vblendps_avx(auVar7,_DAT_01feba10,0xe);
                auVar136 = vrsqrtss_avx(auVar262,auVar262);
                fVar99 = auVar7._0_4_;
                fVar197 = auVar136._0_4_;
                auVar136 = vdpps_avx(_local_940,auVar235,0x7f);
                fVar197 = fVar197 * 1.5 + fVar99 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar141._0_4_ = auVar235._0_4_ * fVar99;
                auVar141._4_4_ = auVar235._4_4_ * fVar99;
                auVar141._8_4_ = auVar235._8_4_ * fVar99;
                auVar141._12_4_ = auVar235._12_4_ * fVar99;
                fVar233 = auVar136._0_4_;
                auVar218._0_4_ = local_940._0_4_ * fVar233;
                auVar218._4_4_ = local_940._4_4_ * fVar233;
                fVar240 = local_940._8_4_;
                auVar218._8_4_ = fVar240 * fVar233;
                fVar241 = local_940._12_4_;
                auVar218._12_4_ = fVar241 * fVar233;
                auVar136 = vsubps_avx(auVar141,auVar218);
                auVar262 = vrcpss_avx(auVar262,auVar262);
                auVar235 = vfnmadd213ss_fma(auVar262,auVar7,auVar156);
                fVar233 = auVar262._0_4_ * auVar235._0_4_;
                auVar270 = vmaxss_avx(ZEXT416((uint)local_880._0_4_),
                                      ZEXT416((uint)(auVar270._0_4_ * (float)local_6e0._0_4_)));
                local_a60._0_8_ = local_940 ^ 0x8000000080000000;
                local_a60._8_4_ = -fVar240;
                local_a60._12_4_ = -fVar241;
                auVar188._0_4_ = fVar197 * auVar136._0_4_ * fVar233;
                auVar188._4_4_ = fVar197 * auVar136._4_4_ * fVar233;
                auVar188._8_4_ = fVar197 * auVar136._8_4_ * fVar233;
                auVar188._12_4_ = fVar197 * auVar136._12_4_ * fVar233;
                local_a80._0_4_ = local_940._0_4_ * fVar197;
                local_a80._4_4_ = local_940._4_4_ * fVar197;
                local_a80._8_4_ = fVar240 * fVar197;
                local_a80._12_4_ = fVar241 * fVar197;
                local_840._0_4_ = auVar270._0_4_;
                if (fVar99 < -fVar99) {
                  local_a40._0_4_ = auVar111._0_4_;
                  local_960._0_16_ = auVar188;
                  auVar280 = ZEXT1664(_local_940);
                  fVar197 = sqrtf(fVar99);
                  auVar270 = ZEXT416((uint)local_840._0_4_);
                  auVar111 = ZEXT416((uint)local_a40._0_4_);
                  auVar188 = local_960._0_16_;
                }
                else {
                  auVar262 = vsqrtss_avx(auVar7,auVar7);
                  fVar197 = auVar262._0_4_;
                }
                auVar262 = vdpps_avx(_local_7e0,local_a80._0_16_,0x7f);
                auVar235 = vfmadd213ss_fma(ZEXT416((uint)local_880._0_4_),auVar111,auVar270);
                auVar7 = vdpps_avx(local_a60._0_16_,local_a80._0_16_,0x7f);
                auVar136 = vdpps_avx(_local_7e0,auVar188,0x7f);
                local_a80._0_16_ = vdpps_avx(local_a00._0_16_,local_a80._0_16_,0x7f);
                auVar254 = ZEXT1664(local_a80._0_16_);
                auVar111 = vfmadd213ss_fma(ZEXT416((uint)(auVar111._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_880._0_4_ / fVar197)),
                                           auVar235);
                local_a40._0_4_ = auVar111._0_4_;
                auVar113._0_4_ = auVar262._0_4_ * auVar262._0_4_;
                auVar113._4_4_ = auVar262._4_4_ * auVar262._4_4_;
                auVar113._8_4_ = auVar262._8_4_ * auVar262._8_4_;
                auVar113._12_4_ = auVar262._12_4_ * auVar262._12_4_;
                auVar111 = vdpps_avx(_local_7e0,local_a60._0_16_,0x7f);
                auVar104 = vsubps_avx(local_ac0._0_16_,auVar113);
                auVar235 = vrsqrtss_avx(auVar104,auVar104);
                fVar233 = auVar104._0_4_;
                fVar197 = auVar235._0_4_;
                fVar197 = fVar197 * 1.5 + fVar233 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar235 = vdpps_avx(_local_7e0,local_a00._0_16_,0x7f);
                local_a60._0_16_ = ZEXT416((uint)(auVar7._0_4_ + auVar136._0_4_));
                auVar111 = vfnmadd231ss_fma(auVar111,auVar262,local_a60._0_16_);
                auVar7 = vfnmadd231ss_fma(auVar235,auVar262,local_a80._0_16_);
                if (fVar233 < 0.0) {
                  local_960._0_16_ = auVar262;
                  local_8e0._0_16_ = auVar111;
                  local_860._0_4_ = fVar197;
                  local_8a0._0_16_ = auVar7;
                  auVar254 = ZEXT1664(local_a80._0_16_);
                  auVar280 = ZEXT1664(auVar280._0_16_);
                  fVar233 = sqrtf(fVar233);
                  auVar270 = ZEXT416((uint)local_840._0_4_);
                  fVar197 = (float)local_860._0_4_;
                  auVar7 = local_8a0._0_16_;
                  auVar111 = local_8e0._0_16_;
                  auVar262 = local_960._0_16_;
                }
                else {
                  auVar136 = vsqrtss_avx(auVar104,auVar104);
                  fVar233 = auVar136._0_4_;
                }
                auVar239 = ZEXT1664(_local_940);
                auVar136 = vpermilps_avx(local_820._0_16_,0xff);
                auVar235 = vshufps_avx(_local_940,_local_940,0xff);
                auVar111 = vfmsub213ss_fma(auVar111,ZEXT416((uint)fVar197),auVar235);
                auVar189._0_8_ = local_a80._0_8_ ^ 0x8000000080000000;
                auVar189._8_4_ = local_a80._8_4_ ^ 0x80000000;
                auVar189._12_4_ = local_a80._12_4_ ^ 0x80000000;
                auVar203._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
                auVar203._8_4_ = auVar111._8_4_ ^ 0x80000000;
                auVar203._12_4_ = auVar111._12_4_ ^ 0x80000000;
                auVar292 = ZEXT1664(local_a60._0_16_);
                auVar104 = ZEXT416((uint)(auVar7._0_4_ * fVar197));
                auVar7 = vfmsub231ss_fma(ZEXT416((uint)(auVar111._0_4_ * local_a80._0_4_)),
                                         local_a60._0_16_,auVar104);
                auVar111 = vinsertps_avx(auVar104,auVar189,0x10);
                uVar98 = auVar7._0_4_;
                auVar190._4_4_ = uVar98;
                auVar190._0_4_ = uVar98;
                auVar190._8_4_ = uVar98;
                auVar190._12_4_ = uVar98;
                auVar111 = vdivps_avx(auVar111,auVar190);
                auVar104 = ZEXT416((uint)(fVar233 - auVar136._0_4_));
                auVar136 = vinsertps_avx(auVar262,auVar104,0x10);
                auVar164._0_4_ = auVar136._0_4_ * auVar111._0_4_;
                auVar164._4_4_ = auVar136._4_4_ * auVar111._4_4_;
                auVar164._8_4_ = auVar136._8_4_ * auVar111._8_4_;
                auVar164._12_4_ = auVar136._12_4_ * auVar111._12_4_;
                auVar111 = vinsertps_avx(auVar203,local_a60._0_16_,0x1c);
                auVar111 = vdivps_avx(auVar111,auVar190);
                auVar7 = vhaddps_avx(auVar164,auVar164);
                auVar191._0_4_ = auVar136._0_4_ * auVar111._0_4_;
                auVar191._4_4_ = auVar136._4_4_ * auVar111._4_4_;
                auVar191._8_4_ = auVar136._8_4_ * auVar111._8_4_;
                auVar191._12_4_ = auVar136._12_4_ * auVar111._12_4_;
                auVar111 = vhaddps_avx(auVar191,auVar191);
                fVar233 = (float)local_ae0._0_4_ - auVar7._0_4_;
                auVar174 = ZEXT464((uint)fVar233);
                fVar197 = (float)local_b00._0_4_ - auVar111._0_4_;
                auVar271 = ZEXT464((uint)fVar197);
                auVar111 = vandps_avx(auVar262,local_9e0);
                bVar56 = true;
                fVar210 = (float)local_a20._0_4_;
                fVar266 = (float)local_a20._4_4_;
                fVar267 = fStack_a18;
                fVar268 = fStack_a14;
                fVar293 = fStack_a10;
                fVar294 = fStack_a0c;
                fVar295 = fStack_a08;
                fVar296 = fStack_a04;
                if (auVar111._0_4_ < (float)local_a40._0_4_) {
                  auVar270 = vfmadd231ss_fma(ZEXT416((uint)(auVar270._0_4_ + (float)local_a40._0_4_)
                                                    ),local_800._0_16_,ZEXT416(0x36000000));
                  auVar111 = vandps_avx(auVar104,local_9e0);
                  if (auVar111._0_4_ < auVar270._0_4_) {
                    fVar197 = fVar197 + (float)local_7b0._0_4_;
                    auVar271 = ZEXT464((uint)fVar197);
                    if (((((ray->org).field_0.m128[3] <= fVar197) &&
                         (fVar99 = ray->tfar, fVar197 <= fVar99)) && (0.0 <= fVar233)) &&
                       (fVar233 <= 1.0)) {
                      auVar111 = vrsqrtss_avx(local_ac0._0_16_,local_ac0._0_16_);
                      fVar240 = auVar111._0_4_;
                      pGVar4 = (context->scene->geometries).items[local_a88].ptr;
                      if ((pGVar4->mask & ray->mask) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_R14B = 1;
                        }
                        else {
                          fVar240 = fVar240 * 1.5 +
                                    local_ac0._0_4_ * -0.5 * fVar240 * fVar240 * fVar240;
                          auVar142._0_4_ = fVar240 * (float)local_7e0;
                          auVar142._4_4_ = fVar240 * (float)auStack_7dc._0_4_;
                          auVar142._8_4_ = fVar240 * (float)auStack_7dc._4_4_;
                          auVar142._12_4_ = fVar240 * fStack_7d4;
                          auVar7 = vfmadd213ps_fma(auVar235,auVar142,_local_940);
                          auVar111 = vshufps_avx(auVar142,auVar142,0xc9);
                          auVar270 = vshufps_avx(_local_940,_local_940,0xc9);
                          auVar143._0_4_ = auVar142._0_4_ * auVar270._0_4_;
                          auVar143._4_4_ = auVar142._4_4_ * auVar270._4_4_;
                          auVar143._8_4_ = auVar142._8_4_ * auVar270._8_4_;
                          auVar143._12_4_ = auVar142._12_4_ * auVar270._12_4_;
                          auVar262 = vfmsub231ps_fma(auVar143,_local_940,auVar111);
                          auVar111 = vshufps_avx(auVar262,auVar262,0xc9);
                          auVar270 = vshufps_avx(auVar7,auVar7,0xc9);
                          auVar262 = vshufps_avx(auVar262,auVar262,0xd2);
                          auVar114._0_4_ = auVar7._0_4_ * auVar262._0_4_;
                          auVar114._4_4_ = auVar7._4_4_ * auVar262._4_4_;
                          auVar114._8_4_ = auVar7._8_4_ * auVar262._8_4_;
                          auVar114._12_4_ = auVar7._12_4_ * auVar262._12_4_;
                          auVar270 = vfmsub231ps_fma(auVar114,auVar111,auVar270);
                          auVar111 = vshufps_avx(auVar270,auVar270,0xe9);
                          local_920 = vmovlps_avx(auVar111);
                          local_918 = auVar270._0_4_;
                          local_910 = 0;
                          local_90c = (undefined4)local_8e8;
                          local_908 = (undefined4)local_a88;
                          local_904 = context->user->instID[0];
                          local_900 = context->user->instPrimID[0];
                          ray->tfar = fVar197;
                          local_b04 = -1;
                          local_990.valid = &local_b04;
                          local_990.geometryUserPtr = pGVar4->userPtr;
                          local_990.context = context->user;
                          local_990.hit = (RTCHitN *)&local_920;
                          local_990.N = 1;
                          local_ae0._0_16_ = ZEXT416((uint)fVar233);
                          local_b00._0_16_ = ZEXT416((uint)fVar197);
                          local_ac0._0_4_ = fVar99;
                          local_990.ray = (RTCRayN *)ray;
                          local_914 = fVar233;
                          if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016b70e1:
                            p_Var5 = context->args->filter;
                            fVar210 = (float)local_a20._0_4_;
                            fVar266 = (float)local_a20._4_4_;
                            fVar267 = fStack_a18;
                            fVar268 = fStack_a14;
                            fVar293 = fStack_a10;
                            fVar294 = fStack_a0c;
                            fVar295 = fStack_a08;
                            fVar296 = fStack_a04;
                            if (p_Var5 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                                auVar239 = ZEXT1664(auVar239._0_16_);
                                auVar254 = ZEXT1664(auVar254._0_16_);
                                auVar280 = ZEXT1664(auVar280._0_16_);
                                auVar292 = ZEXT1664(auVar292._0_16_);
                                (*p_Var5)(&local_990);
                                auVar271 = ZEXT1664(local_b00._0_16_);
                                auVar174 = ZEXT1664(local_ae0._0_16_);
                                fVar99 = (float)local_ac0._0_4_;
                                fVar210 = (float)local_a20._0_4_;
                                fVar266 = (float)local_a20._4_4_;
                                fVar267 = fStack_a18;
                                fVar268 = fStack_a14;
                                fVar293 = fStack_a10;
                                fVar294 = fStack_a0c;
                                fVar295 = fStack_a08;
                                fVar296 = fStack_a04;
                              }
                              if (*local_990.valid == 0) goto LAB_016b7139;
                            }
                            unaff_R14B = 1;
                          }
                          else {
                            auVar239 = ZEXT1664(_local_940);
                            auVar254 = ZEXT1664(auVar254._0_16_);
                            auVar280 = ZEXT1664(auVar280._0_16_);
                            auVar292 = ZEXT1664(local_a60._0_16_);
                            (*pGVar4->occlusionFilterN)(&local_990);
                            auVar271 = ZEXT1664(local_b00._0_16_);
                            auVar174 = ZEXT1664(local_ae0._0_16_);
                            fVar99 = (float)local_ac0._0_4_;
                            fVar210 = (float)local_a20._0_4_;
                            fVar266 = (float)local_a20._4_4_;
                            fVar267 = fStack_a18;
                            fVar268 = fStack_a14;
                            fVar293 = fStack_a10;
                            fVar294 = fStack_a0c;
                            fVar295 = fStack_a08;
                            fVar296 = fStack_a04;
                            if (*local_990.valid != 0) goto LAB_016b70e1;
LAB_016b7139:
                            unaff_R14B = 0;
                          }
                          if (unaff_R14B == 0) {
                            ray->tfar = fVar99;
                          }
                        }
                        bVar56 = false;
                        goto LAB_016b6f72;
                      }
                    }
                    bVar56 = false;
                    unaff_R14B = 0;
                  }
                }
LAB_016b6f72:
                if (!bVar56) goto LAB_016b7153;
                lVar96 = lVar96 + -1;
              } while (lVar96 != 0);
              unaff_R14B = 0;
LAB_016b7153:
              unaff_R14B = unaff_R14B & 1;
              bVar95 = bVar95 | unaff_R14B;
              fVar197 = ray->tfar;
              auVar127._4_4_ = fVar197;
              auVar127._0_4_ = fVar197;
              auVar127._8_4_ = fVar197;
              auVar127._12_4_ = fVar197;
              auVar127._16_4_ = fVar197;
              auVar127._20_4_ = fVar197;
              auVar127._24_4_ = fVar197;
              auVar127._28_4_ = fVar197;
              auVar222 = vcmpps_avx(_local_720,auVar127,2);
              auVar125 = vandps_avx(auVar222,local_5e0);
              local_5e0 = local_5e0 & auVar222;
            } while ((((((((local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_5e0 >> 0x7f,0) != '\0') ||
                       (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_5e0 >> 0xbf,0) != '\0') ||
                     (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_5e0[0x1f] < '\0');
          }
          auVar154._0_4_ = fVar210 + local_480._0_4_;
          auVar154._4_4_ = fVar266 + local_480._4_4_;
          auVar154._8_4_ = fVar267 + local_480._8_4_;
          auVar154._12_4_ = fVar268 + local_480._12_4_;
          auVar154._16_4_ = fVar293 + local_480._16_4_;
          auVar154._20_4_ = fVar294 + local_480._20_4_;
          auVar154._24_4_ = fVar295 + local_480._24_4_;
          auVar154._28_4_ = fVar296 + local_480._28_4_;
          fVar197 = ray->tfar;
          auVar196._4_4_ = fVar197;
          auVar196._0_4_ = fVar197;
          auVar196._8_4_ = fVar197;
          auVar196._12_4_ = fVar197;
          auVar196._16_4_ = fVar197;
          auVar196._20_4_ = fVar197;
          auVar196._24_4_ = fVar197;
          auVar196._28_4_ = fVar197;
          auVar222 = vcmpps_avx(auVar154,auVar196,2);
          auVar125 = vandps_avx(local_580,local_560);
          auVar125 = vandps_avx(auVar222,auVar125);
          auVar204._0_4_ = fVar210 + local_4c0._0_4_;
          auVar204._4_4_ = fVar266 + local_4c0._4_4_;
          auVar204._8_4_ = fVar267 + local_4c0._8_4_;
          auVar204._12_4_ = fVar268 + local_4c0._12_4_;
          auVar204._16_4_ = fVar293 + local_4c0._16_4_;
          auVar204._20_4_ = fVar294 + local_4c0._20_4_;
          auVar204._24_4_ = fVar295 + local_4c0._24_4_;
          auVar204._28_4_ = fVar296 + local_4c0._28_4_;
          auVar219 = vcmpps_avx(auVar204,auVar196,2);
          auVar222 = vandps_avx(_local_780,local_740);
          auVar222 = vandps_avx(auVar219,auVar222);
          auVar222 = vorps_avx(auVar125,auVar222);
          if ((((((((auVar222 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar222 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar222 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar222 >> 0x7f,0) != '\0') ||
                (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar222 >> 0xbf,0) != '\0') ||
              (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar222[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar222;
            auVar125 = vblendvps_avx(_local_4c0,local_480,auVar125);
            *(undefined1 (*) [32])(auStack_160 + uVar93 * 0x60) = auVar125;
            uVar100 = vmovlps_avx(local_7a0);
            *(undefined8 *)(afStack_140 + uVar93 * 0x18) = uVar100;
            auStack_138[uVar93 * 0x18] = (int)local_640 + 1;
            uVar93 = (ulong)((int)uVar93 + 1);
          }
        }
      }
    }
    fVar197 = ray->tfar;
    auVar124._4_4_ = fVar197;
    auVar124._0_4_ = fVar197;
    auVar124._8_4_ = fVar197;
    auVar124._12_4_ = fVar197;
    auVar124._16_4_ = fVar197;
    auVar124._20_4_ = fVar197;
    auVar124._24_4_ = fVar197;
    auVar124._28_4_ = fVar197;
    uVar94 = uVar93;
    do {
      if ((int)uVar94 == 0) {
        if (bVar95 != 0) {
          return local_b11;
        }
        fVar197 = ray->tfar;
        auVar115._4_4_ = fVar197;
        auVar115._0_4_ = fVar197;
        auVar115._8_4_ = fVar197;
        auVar115._12_4_ = fVar197;
        auVar111 = vcmpps_avx(local_4d0,auVar115,2);
        uVar92 = vmovmskps_avx(auVar111);
        uVar92 = (uint)local_788 & uVar92;
        local_b11 = uVar92 != 0;
        if (!local_b11) {
          return local_b11;
        }
        goto LAB_016b4b6f;
      }
      uVar93 = (ulong)((int)uVar94 - 1);
      lVar96 = uVar93 * 0x60;
      auVar125 = *(undefined1 (*) [32])(auStack_160 + lVar96);
      auVar145._0_4_ = fVar210 + auVar125._0_4_;
      auVar145._4_4_ = fVar266 + auVar125._4_4_;
      auVar145._8_4_ = fVar267 + auVar125._8_4_;
      auVar145._12_4_ = fVar268 + auVar125._12_4_;
      auVar145._16_4_ = fVar293 + auVar125._16_4_;
      auVar145._20_4_ = fVar294 + auVar125._20_4_;
      auVar145._24_4_ = fVar295 + auVar125._24_4_;
      auVar145._28_4_ = fVar296 + auVar125._28_4_;
      auVar219 = vcmpps_avx(auVar145,auVar124,2);
      auVar222 = vandps_avx(auVar219,*(undefined1 (*) [32])(auStack_180 + lVar96));
      local_480 = auVar222;
      auVar219 = *(undefined1 (*) [32])(auStack_180 + lVar96) & auVar219;
      bVar64 = (auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar65 = (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar63 = (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar62 = SUB321(auVar219 >> 0x7f,0) == '\0';
      bVar61 = (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar60 = SUB321(auVar219 >> 0xbf,0) == '\0';
      bVar57 = (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar56 = -1 < auVar219[0x1f];
      if (((((((!bVar64 || !bVar65) || !bVar63) || !bVar62) || !bVar61) || !bVar60) || !bVar57) ||
          !bVar56) {
        auVar195._8_4_ = 0x7f800000;
        auVar195._0_8_ = 0x7f8000007f800000;
        auVar195._12_4_ = 0x7f800000;
        auVar195._16_4_ = 0x7f800000;
        auVar195._20_4_ = 0x7f800000;
        auVar195._24_4_ = 0x7f800000;
        auVar195._28_4_ = 0x7f800000;
        auVar125 = vblendvps_avx(auVar195,auVar125,auVar222);
        auVar219 = vshufps_avx(auVar125,auVar125,0xb1);
        auVar219 = vminps_avx(auVar125,auVar219);
        auVar8 = vshufpd_avx(auVar219,auVar219,5);
        auVar219 = vminps_avx(auVar219,auVar8);
        auVar8 = vpermpd_avx2(auVar219,0x4e);
        auVar219 = vminps_avx(auVar219,auVar8);
        auVar125 = vcmpps_avx(auVar125,auVar219,0);
        auVar219 = auVar222 & auVar125;
        if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar219 >> 0x7f,0) != '\0') ||
              (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar219 >> 0xbf,0) != '\0') ||
            (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar219[0x1f] < '\0') {
          auVar222 = vandps_avx(auVar125,auVar222);
        }
        fVar197 = afStack_140[uVar93 * 0x18 + 1];
        local_640 = (ulong)auStack_138[uVar93 * 0x18];
        uVar92 = vmovmskps_avx(auVar222);
        iVar17 = 0;
        for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
          iVar17 = iVar17 + 1;
        }
        fVar233 = afStack_140[uVar93 * 0x18];
        auVar146._4_4_ = fVar233;
        auVar146._0_4_ = fVar233;
        auVar146._8_4_ = fVar233;
        auVar146._12_4_ = fVar233;
        auVar146._16_4_ = fVar233;
        auVar146._20_4_ = fVar233;
        auVar146._24_4_ = fVar233;
        auVar146._28_4_ = fVar233;
        *(undefined4 *)(local_480 + (uint)(iVar17 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar96) = local_480;
        if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_480 >> 0x7f,0) != '\0') ||
              (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_480 >> 0xbf,0) != '\0') ||
            (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_480[0x1f] < '\0') {
          uVar93 = uVar94;
        }
        fVar197 = fVar197 - fVar233;
        auVar170._4_4_ = fVar197;
        auVar170._0_4_ = fVar197;
        auVar170._8_4_ = fVar197;
        auVar170._12_4_ = fVar197;
        auVar170._16_4_ = fVar197;
        auVar170._20_4_ = fVar197;
        auVar170._24_4_ = fVar197;
        auVar170._28_4_ = fVar197;
        auVar111 = vfmadd132ps_fma(auVar170,auVar146,_DAT_02020f20);
        _local_4c0 = ZEXT1632(auVar111);
        local_7a0._8_8_ = 0;
        local_7a0._0_8_ = *(ulong *)(local_4c0 + (uint)(iVar17 << 2));
      }
      uVar94 = uVar93;
    } while (((((((bVar64 && bVar65) && bVar63) && bVar62) && bVar61) && bVar60) && bVar57) &&
             bVar56);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }